

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersectorK<4,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [28];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  undefined4 uVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  bool bVar70;
  bool bVar71;
  long lVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  float fVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [28];
  undefined1 auVar89 [32];
  undefined1 auVar90 [24];
  int iVar91;
  uint uVar92;
  ulong uVar93;
  uint uVar94;
  ulong uVar95;
  uint uVar96;
  long lVar97;
  Geometry *pGVar98;
  ulong uVar99;
  undefined4 uVar100;
  undefined8 uVar102;
  float fVar123;
  vint4 bi_2;
  undefined1 auVar103 [16];
  float fVar125;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar101;
  float fVar122;
  float fVar124;
  float fVar126;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar107 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar130;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar150;
  undefined1 auVar148 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar151;
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar165 [32];
  float fVar170;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar171;
  float fVar181;
  vint4 ai_2;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  vint4 bi;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [64];
  vint4 ai_1;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar223;
  undefined1 auVar221 [32];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar222 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  undefined4 uVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar236 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar245;
  float fVar246;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  RTCFilterFunctionNArguments local_7b0;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 (*local_6c8) [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  undefined1 auStack_4fc [8];
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  int local_460;
  int local_45c;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_400 [32];
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar149 [64];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar216 [16];
  
  PVar8 = prim[1];
  uVar99 = (ulong)(byte)PVar8;
  lVar72 = uVar99 * 0x19;
  fVar152 = *(float *)(prim + lVar72 + 0x12);
  auVar187 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar187 = vinsertps_avx(auVar187,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar187 = vsubps_avx(auVar187,*(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar103._0_4_ = fVar152 * auVar187._0_4_;
  auVar103._4_4_ = fVar152 * auVar187._4_4_;
  auVar103._8_4_ = fVar152 * auVar187._8_4_;
  auVar103._12_4_ = fVar152 * auVar187._12_4_;
  auVar197._0_4_ = fVar152 * auVar12._0_4_;
  auVar197._4_4_ = fVar152 * auVar12._4_4_;
  auVar197._8_4_ = fVar152 * auVar12._8_4_;
  auVar197._12_4_ = fVar152 * auVar12._12_4_;
  auVar187 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar192 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar192 = vcvtdq2ps_avx(auVar192);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar99 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  uVar93 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + uVar99 + 6)));
  auVar105 = vcvtdq2ps_avx(auVar105);
  uVar93 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar153 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar241._4_4_ = auVar197._0_4_;
  auVar241._0_4_ = auVar197._0_4_;
  auVar241._8_4_ = auVar197._0_4_;
  auVar241._12_4_ = auVar197._0_4_;
  auVar132 = vshufps_avx(auVar197,auVar197,0x55);
  auVar104 = vshufps_avx(auVar197,auVar197,0xaa);
  fVar152 = auVar104._0_4_;
  auVar230._0_4_ = fVar152 * auVar13._0_4_;
  fVar151 = auVar104._4_4_;
  auVar230._4_4_ = fVar151 * auVar13._4_4_;
  fVar123 = auVar104._8_4_;
  auVar230._8_4_ = fVar123 * auVar13._8_4_;
  fVar125 = auVar104._12_4_;
  auVar230._12_4_ = fVar125 * auVar13._12_4_;
  auVar227._0_4_ = auVar15._0_4_ * fVar152;
  auVar227._4_4_ = auVar15._4_4_ * fVar151;
  auVar227._8_4_ = auVar15._8_4_ * fVar123;
  auVar227._12_4_ = auVar15._12_4_ * fVar125;
  auVar213._0_4_ = auVar153._0_4_ * fVar152;
  auVar213._4_4_ = auVar153._4_4_ * fVar151;
  auVar213._8_4_ = auVar153._8_4_ * fVar123;
  auVar213._12_4_ = auVar153._12_4_ * fVar125;
  auVar104 = vfmadd231ps_fma(auVar230,auVar132,auVar12);
  auVar133 = vfmadd231ps_fma(auVar227,auVar132,auVar14);
  auVar132 = vfmadd231ps_fma(auVar213,auVar105,auVar132);
  auVar172 = vfmadd231ps_fma(auVar104,auVar241,auVar187);
  auVar133 = vfmadd231ps_fma(auVar133,auVar241,auVar192);
  auVar228 = ZEXT1664(auVar133);
  auVar183 = vfmadd231ps_fma(auVar132,auVar106,auVar241);
  auVar242._4_4_ = auVar103._0_4_;
  auVar242._0_4_ = auVar103._0_4_;
  auVar242._8_4_ = auVar103._0_4_;
  auVar242._12_4_ = auVar103._0_4_;
  auVar132 = vshufps_avx(auVar103,auVar103,0x55);
  auVar104 = vshufps_avx(auVar103,auVar103,0xaa);
  fVar152 = auVar104._0_4_;
  auVar198._0_4_ = fVar152 * auVar13._0_4_;
  fVar151 = auVar104._4_4_;
  auVar198._4_4_ = fVar151 * auVar13._4_4_;
  fVar123 = auVar104._8_4_;
  auVar198._8_4_ = fVar123 * auVar13._8_4_;
  fVar125 = auVar104._12_4_;
  auVar198._12_4_ = fVar125 * auVar13._12_4_;
  auVar131._0_4_ = auVar15._0_4_ * fVar152;
  auVar131._4_4_ = auVar15._4_4_ * fVar151;
  auVar131._8_4_ = auVar15._8_4_ * fVar123;
  auVar131._12_4_ = auVar15._12_4_ * fVar125;
  auVar104._0_4_ = auVar153._0_4_ * fVar152;
  auVar104._4_4_ = auVar153._4_4_ * fVar151;
  auVar104._8_4_ = auVar153._8_4_ * fVar123;
  auVar104._12_4_ = auVar153._12_4_ * fVar125;
  auVar12 = vfmadd231ps_fma(auVar198,auVar132,auVar12);
  auVar13 = vfmadd231ps_fma(auVar131,auVar132,auVar14);
  auVar14 = vfmadd231ps_fma(auVar104,auVar132,auVar105);
  auVar15 = vfmadd231ps_fma(auVar12,auVar242,auVar187);
  auVar105 = vfmadd231ps_fma(auVar13,auVar242,auVar192);
  auVar153 = vfmadd231ps_fma(auVar14,auVar242,auVar106);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar187 = vandps_avx(auVar172,local_2d0);
  auVar182._8_4_ = 0x219392ef;
  auVar182._0_8_ = 0x219392ef219392ef;
  auVar182._12_4_ = 0x219392ef;
  auVar187 = vcmpps_avx(auVar187,auVar182,1);
  auVar12 = vblendvps_avx(auVar172,auVar182,auVar187);
  auVar187 = vandps_avx(auVar133,local_2d0);
  auVar187 = vcmpps_avx(auVar187,auVar182,1);
  auVar13 = vblendvps_avx(auVar133,auVar182,auVar187);
  auVar187 = vandps_avx(auVar183,local_2d0);
  auVar187 = vcmpps_avx(auVar187,auVar182,1);
  auVar187 = vblendvps_avx(auVar183,auVar182,auVar187);
  auVar192 = vrcpps_avx(auVar12);
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = &DAT_3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar192,auVar209);
  auVar192 = vfmadd132ps_fma(auVar12,auVar192,auVar192);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar209);
  auVar14 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar187);
  auVar187 = vfnmadd213ps_fma(auVar187,auVar12,auVar209);
  auVar106 = vfmadd132ps_fma(auVar187,auVar12,auVar12);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar187 = vpmovsxwd_avx(auVar187);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar187,auVar15);
  auVar183._0_4_ = auVar192._0_4_ * auVar187._0_4_;
  auVar183._4_4_ = auVar192._4_4_ * auVar187._4_4_;
  auVar183._8_4_ = auVar192._8_4_ * auVar187._8_4_;
  auVar183._12_4_ = auVar192._12_4_ * auVar187._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar187 = vpmovsxwd_avx(auVar12);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar187,auVar15);
  auVar199._0_4_ = auVar192._0_4_ * auVar187._0_4_;
  auVar199._4_4_ = auVar192._4_4_ * auVar187._4_4_;
  auVar199._8_4_ = auVar192._8_4_ * auVar187._8_4_;
  auVar199._12_4_ = auVar192._12_4_ * auVar187._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar99 * -2 + 6);
  auVar187 = vpmovsxwd_avx(auVar192);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar187,auVar105);
  auVar214._0_4_ = auVar187._0_4_ * auVar14._0_4_;
  auVar214._4_4_ = auVar187._4_4_ * auVar14._4_4_;
  auVar214._8_4_ = auVar187._8_4_ * auVar14._8_4_;
  auVar214._12_4_ = auVar187._12_4_ * auVar14._12_4_;
  auVar187 = vcvtdq2ps_avx(auVar12);
  auVar187 = vsubps_avx(auVar187,auVar105);
  auVar132._0_4_ = auVar14._0_4_ * auVar187._0_4_;
  auVar132._4_4_ = auVar14._4_4_ * auVar187._4_4_;
  auVar132._8_4_ = auVar14._8_4_ * auVar187._8_4_;
  auVar132._12_4_ = auVar14._12_4_ * auVar187._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar93 + uVar99 + 6);
  auVar187 = vpmovsxwd_avx(auVar14);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar187,auVar153);
  auVar172._0_4_ = auVar106._0_4_ * auVar187._0_4_;
  auVar172._4_4_ = auVar106._4_4_ * auVar187._4_4_;
  auVar172._8_4_ = auVar106._8_4_ * auVar187._8_4_;
  auVar172._12_4_ = auVar106._12_4_ * auVar187._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar187 = vpmovsxwd_avx(auVar15);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar187 = vsubps_avx(auVar187,auVar153);
  auVar105._0_4_ = auVar106._0_4_ * auVar187._0_4_;
  auVar105._4_4_ = auVar106._4_4_ * auVar187._4_4_;
  auVar105._8_4_ = auVar106._8_4_ * auVar187._8_4_;
  auVar105._12_4_ = auVar106._12_4_ * auVar187._12_4_;
  auVar187 = vpminsd_avx(auVar183,auVar199);
  auVar12 = vpminsd_avx(auVar214,auVar132);
  auVar187 = vmaxps_avx(auVar187,auVar12);
  auVar12 = vpminsd_avx(auVar172,auVar105);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar216._4_4_ = uVar4;
  auVar216._0_4_ = uVar4;
  auVar216._8_4_ = uVar4;
  auVar216._12_4_ = uVar4;
  auVar222 = ZEXT1664(auVar216);
  auVar12 = vmaxps_avx(auVar12,auVar216);
  auVar187 = vmaxps_avx(auVar187,auVar12);
  local_2e0._0_4_ = auVar187._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar187._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar187._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar187._12_4_ * 0.99999964;
  auVar187 = vpmaxsd_avx(auVar183,auVar199);
  auVar12 = vpmaxsd_avx(auVar214,auVar132);
  auVar187 = vminps_avx(auVar187,auVar12);
  auVar12 = vpmaxsd_avx(auVar172,auVar105);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar153._4_4_ = uVar4;
  auVar153._0_4_ = uVar4;
  auVar153._8_4_ = uVar4;
  auVar153._12_4_ = uVar4;
  auVar12 = vminps_avx(auVar12,auVar153);
  auVar187 = vminps_avx(auVar187,auVar12);
  auVar106._0_4_ = auVar187._0_4_ * 1.0000004;
  auVar106._4_4_ = auVar187._4_4_ * 1.0000004;
  auVar106._8_4_ = auVar187._8_4_ * 1.0000004;
  auVar106._12_4_ = auVar187._12_4_ * 1.0000004;
  auVar133[4] = PVar8;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar8;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar8;
  auVar133._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar133,_DAT_01ff0cf0);
  auVar187 = vcmpps_avx(local_2e0,auVar106,2);
  auVar187 = vandps_avx(auVar187,auVar12);
  uVar94 = vmovmskps_avx(auVar187);
  if (uVar94 != 0) {
    uVar94 = uVar94 & 0xff;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_6c8 = (undefined1 (*) [32])&local_1c0;
    iVar91 = 1 << ((uint)k & 0x1f);
    auVar110._4_4_ = iVar91;
    auVar110._0_4_ = iVar91;
    auVar110._8_4_ = iVar91;
    auVar110._12_4_ = iVar91;
    auVar110._16_4_ = iVar91;
    auVar110._20_4_ = iVar91;
    auVar110._24_4_ = iVar91;
    auVar110._28_4_ = iVar91;
    auVar118 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar110 = vpand_avx2(auVar110,auVar118);
    local_2c0 = vpcmpeqd_avx2(auVar110,auVar118);
    do {
      auVar110 = auVar222._0_32_;
      auVar118 = auVar228._0_32_;
      lVar18 = 0;
      uVar99 = (ulong)uVar94;
      for (uVar93 = uVar99; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar99 = uVar99 - 1 & uVar99;
      uVar4 = *(undefined4 *)(prim + lVar18 * 4 + 6);
      uVar93 = (ulong)(uint)((int)lVar18 << 6);
      uVar94 = *(uint *)(prim + 2);
      pGVar98 = (context->scene->geometries).items[uVar94].ptr;
      pPVar1 = prim + uVar93 + lVar72 + 0x16;
      uVar80 = *(undefined8 *)pPVar1;
      uVar81 = *(undefined8 *)(pPVar1 + 8);
      auVar13 = *(undefined1 (*) [16])pPVar1;
      auVar12 = *(undefined1 (*) [16])pPVar1;
      auVar187 = *(undefined1 (*) [16])pPVar1;
      if (uVar99 != 0) {
        uVar95 = uVar99 - 1 & uVar99;
        for (uVar19 = uVar99; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        }
        if (uVar95 != 0) {
          for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_6e0 = *(undefined1 (*) [16])(prim + uVar93 + lVar72 + 0x26);
      local_6f0 = *(undefined1 (*) [16])(prim + uVar93 + lVar72 + 0x36);
      _local_700 = *(undefined1 (*) [16])(prim + uVar93 + lVar72 + 0x46);
      iVar91 = (int)pGVar98[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar192 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar106 = vinsertps_avx(auVar192,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar106);
      uVar100 = auVar14._0_4_;
      auVar184._4_4_ = uVar100;
      auVar184._0_4_ = uVar100;
      auVar184._8_4_ = uVar100;
      auVar184._12_4_ = uVar100;
      auVar192 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar152 = pre->ray_space[k].vz.field_0.m128[0];
      fVar151 = pre->ray_space[k].vz.field_0.m128[1];
      fVar123 = pre->ray_space[k].vz.field_0.m128[2];
      fVar125 = pre->ray_space[k].vz.field_0.m128[3];
      auVar205._0_4_ = fVar152 * auVar14._0_4_;
      auVar205._4_4_ = fVar151 * auVar14._4_4_;
      auVar205._8_4_ = fVar123 * auVar14._8_4_;
      auVar205._12_4_ = fVar125 * auVar14._12_4_;
      auVar192 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar6,auVar192);
      auVar153 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar5,auVar184);
      auVar192 = vblendps_avx(auVar153,*(undefined1 (*) [16])pPVar1,8);
      auVar15 = vsubps_avx(local_6e0,auVar106);
      uVar100 = auVar15._0_4_;
      auVar206._4_4_ = uVar100;
      auVar206._0_4_ = uVar100;
      auVar206._8_4_ = uVar100;
      auVar206._12_4_ = uVar100;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar217._0_4_ = fVar152 * auVar15._0_4_;
      auVar217._4_4_ = fVar151 * auVar15._4_4_;
      auVar217._8_4_ = fVar123 * auVar15._8_4_;
      auVar217._12_4_ = fVar125 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar6,auVar14);
      auVar132 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar206);
      auVar14 = vblendps_avx(auVar132,local_6e0,8);
      auVar105 = vsubps_avx(local_6f0,auVar106);
      uVar100 = auVar105._0_4_;
      auVar210._4_4_ = uVar100;
      auVar210._0_4_ = uVar100;
      auVar210._8_4_ = uVar100;
      auVar210._12_4_ = uVar100;
      auVar15 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar231._0_4_ = fVar152 * auVar105._0_4_;
      auVar231._4_4_ = fVar151 * auVar105._4_4_;
      auVar231._8_4_ = fVar123 * auVar105._8_4_;
      auVar231._12_4_ = fVar125 * auVar105._12_4_;
      auVar15 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar6,auVar15);
      auVar104 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar210);
      auVar15 = vblendps_avx(auVar104,local_6f0,8);
      auVar105 = vsubps_avx(_local_700,auVar106);
      uVar100 = auVar105._0_4_;
      auVar211._4_4_ = uVar100;
      auVar211._0_4_ = uVar100;
      auVar211._8_4_ = uVar100;
      auVar211._12_4_ = uVar100;
      auVar106 = vshufps_avx(auVar105,auVar105,0x55);
      auVar105 = vshufps_avx(auVar105,auVar105,0xaa);
      auVar235._0_4_ = fVar152 * auVar105._0_4_;
      auVar235._4_4_ = fVar151 * auVar105._4_4_;
      auVar235._8_4_ = fVar123 * auVar105._8_4_;
      auVar235._12_4_ = fVar125 * auVar105._12_4_;
      auVar106 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar6,auVar106);
      auVar133 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar5,auVar211);
      auVar106 = vblendps_avx(auVar133,_local_700,8);
      auVar192 = vandps_avx(auVar192,local_2d0);
      auVar14 = vandps_avx(auVar14,local_2d0);
      auVar105 = vmaxps_avx(auVar192,auVar14);
      auVar192 = vandps_avx(auVar15,local_2d0);
      auVar14 = vandps_avx(auVar106,local_2d0);
      auVar192 = vmaxps_avx(auVar192,auVar14);
      auVar192 = vmaxps_avx(auVar105,auVar192);
      auVar14 = vmovshdup_avx(auVar192);
      auVar14 = vmaxss_avx(auVar14,auVar192);
      auVar192 = vshufpd_avx(auVar192,auVar192,1);
      auVar192 = vmaxss_avx(auVar192,auVar14);
      lVar18 = (long)iVar91 * 0x44;
      auVar14 = vmovshdup_avx(auVar153);
      uVar102 = auVar14._0_8_;
      local_4e0._8_8_ = uVar102;
      local_4e0._0_8_ = uVar102;
      local_4e0._16_8_ = uVar102;
      local_4e0._24_8_ = uVar102;
      auVar14 = vmovshdup_avx(auVar132);
      uVar102 = auVar14._0_8_;
      local_660._8_8_ = uVar102;
      local_660._0_8_ = uVar102;
      local_660._16_8_ = uVar102;
      local_660._24_8_ = uVar102;
      auVar142 = *(undefined1 (*) [32])(bspline_basis0 + lVar18 + 0x908);
      uVar229 = auVar104._0_4_;
      local_640._4_4_ = uVar229;
      local_640._0_4_ = uVar229;
      local_640._8_4_ = uVar229;
      local_640._12_4_ = uVar229;
      local_640._16_4_ = uVar229;
      local_640._20_4_ = uVar229;
      local_640._24_4_ = uVar229;
      local_640._28_4_ = uVar229;
      auVar14 = vmovshdup_avx(auVar104);
      uVar102 = auVar14._0_8_;
      auVar207._8_8_ = uVar102;
      auVar207._0_8_ = uVar102;
      auVar207._16_8_ = uVar102;
      auVar207._24_8_ = uVar102;
      fVar152 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar18 + 0xd8c);
      auVar88 = *(undefined1 (*) [28])(bspline_basis0 + lVar18 + 0xd8c);
      local_720 = auVar133._0_4_;
      auVar14 = vmovshdup_avx(auVar133);
      local_780 = auVar14._0_8_;
      auVar139._4_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xd90);
      auVar139._0_4_ = local_720 * fVar152;
      auVar139._8_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xd94);
      auVar139._12_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xd98);
      auVar139._16_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xd9c);
      auVar139._20_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xda0);
      auVar139._24_4_ = local_720 * *(float *)(bspline_basis0 + lVar18 + 0xda4);
      auVar139._28_4_ = *(undefined4 *)(bspline_basis0 + lVar18 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar139,auVar142,local_640);
      fVar171 = auVar14._0_4_;
      auVar204._0_4_ = fVar171 * fVar152;
      fVar181 = auVar14._4_4_;
      auVar204._4_4_ = fVar181 * *(float *)(bspline_basis0 + lVar18 + 0xd90);
      auVar204._8_4_ = fVar171 * *(float *)(bspline_basis0 + lVar18 + 0xd94);
      auVar204._12_4_ = fVar181 * *(float *)(bspline_basis0 + lVar18 + 0xd98);
      auVar204._16_4_ = fVar171 * *(float *)(bspline_basis0 + lVar18 + 0xd9c);
      auVar204._20_4_ = fVar181 * *(float *)(bspline_basis0 + lVar18 + 0xda0);
      auVar204._24_4_ = fVar171 * *(float *)(bspline_basis0 + lVar18 + 0xda4);
      auVar204._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar204,auVar142,auVar207);
      auVar139 = *(undefined1 (*) [32])(bspline_basis0 + lVar18 + 0x484);
      uVar100 = auVar132._0_4_;
      local_760._4_4_ = uVar100;
      local_760._0_4_ = uVar100;
      local_760._8_4_ = uVar100;
      local_760._12_4_ = uVar100;
      local_760._16_4_ = uVar100;
      local_760._20_4_ = uVar100;
      local_760._24_4_ = uVar100;
      local_760._28_4_ = uVar100;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar139,local_760);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar139,local_660);
      auVar204 = *(undefined1 (*) [32])(bspline_basis0 + lVar18);
      local_540._0_4_ = auVar153._0_4_;
      uVar100 = local_540._0_4_;
      auVar243._4_4_ = local_540._0_4_;
      auVar243._0_4_ = local_540._0_4_;
      auVar243._8_4_ = local_540._0_4_;
      auVar243._12_4_ = local_540._0_4_;
      auVar243._16_4_ = local_540._0_4_;
      auVar243._20_4_ = local_540._0_4_;
      auVar243._24_4_ = local_540._0_4_;
      auVar243._28_4_ = local_540._0_4_;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar204,auVar243);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar204,local_4e0);
      auVar166 = *(undefined1 (*) [32])(bspline_basis1 + lVar18 + 0x908);
      fVar122 = *(float *)(bspline_basis1 + lVar18 + 0xd8c);
      fVar124 = *(float *)(bspline_basis1 + lVar18 + 0xd90);
      fVar126 = *(float *)(bspline_basis1 + lVar18 + 0xd94);
      fVar127 = *(float *)(bspline_basis1 + lVar18 + 0xd98);
      fVar128 = *(float *)(bspline_basis1 + lVar18 + 0xd9c);
      fVar129 = *(float *)(bspline_basis1 + lVar18 + 0xda0);
      fVar170 = *(float *)(bspline_basis1 + lVar18 + 0xda4);
      auVar236._4_4_ = fVar124 * local_720;
      auVar236._0_4_ = fVar122 * local_720;
      auVar236._8_4_ = fVar126 * local_720;
      auVar236._12_4_ = fVar127 * local_720;
      auVar236._16_4_ = fVar128 * local_720;
      auVar236._20_4_ = fVar129 * local_720;
      auVar236._24_4_ = fVar170 * local_720;
      auVar236._28_4_ = *(undefined4 *)(bspline_basis0 + lVar18 + 0xda8);
      auVar106 = vfmadd231ps_fma(auVar236,auVar166,local_640);
      auVar7._4_4_ = fVar124 * fVar181;
      auVar7._0_4_ = fVar122 * fVar171;
      auVar7._8_4_ = fVar126 * fVar171;
      auVar7._12_4_ = fVar127 * fVar181;
      auVar7._16_4_ = fVar128 * fVar171;
      auVar7._20_4_ = fVar129 * fVar181;
      auVar7._24_4_ = fVar170 * fVar171;
      auVar7._28_4_ = uVar229;
      auVar105 = vfmadd231ps_fma(auVar7,auVar166,auVar207);
      auVar236 = *(undefined1 (*) [32])(bspline_basis1 + lVar18 + 0x484);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar236,local_760);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar236,local_660);
      auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar18);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,auVar243);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,local_4e0);
      auVar111 = ZEXT1632(auVar106);
      auVar134 = ZEXT1632(auVar15);
      auVar119 = vsubps_avx(auVar111,auVar134);
      local_300 = ZEXT1632(auVar105);
      local_320 = ZEXT1632(auVar14);
      local_340 = vsubps_avx(local_300,local_320);
      auVar112._0_4_ = auVar14._0_4_ * auVar119._0_4_;
      auVar112._4_4_ = auVar14._4_4_ * auVar119._4_4_;
      auVar112._8_4_ = auVar14._8_4_ * auVar119._8_4_;
      auVar112._12_4_ = auVar14._12_4_ * auVar119._12_4_;
      auVar112._16_4_ = auVar119._16_4_ * 0.0;
      auVar112._20_4_ = auVar119._20_4_ * 0.0;
      auVar112._24_4_ = auVar119._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      fVar152 = local_340._0_4_;
      auVar135._0_4_ = auVar15._0_4_ * fVar152;
      fVar151 = local_340._4_4_;
      auVar135._4_4_ = auVar15._4_4_ * fVar151;
      fVar123 = local_340._8_4_;
      auVar135._8_4_ = auVar15._8_4_ * fVar123;
      fVar125 = local_340._12_4_;
      auVar135._12_4_ = auVar15._12_4_ * fVar125;
      fVar245 = local_340._16_4_;
      auVar135._16_4_ = fVar245 * 0.0;
      fVar246 = local_340._20_4_;
      auVar135._20_4_ = fVar246 * 0.0;
      fVar101 = local_340._24_4_;
      auVar135._24_4_ = fVar101 * 0.0;
      auVar135._28_4_ = 0;
      auVar112 = vsubps_avx(auVar112,auVar135);
      auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar102 = auVar14._0_8_;
      local_80._8_8_ = uVar102;
      local_80._0_8_ = uVar102;
      local_80._16_8_ = uVar102;
      local_80._24_8_ = uVar102;
      auVar15 = vpermilps_avx(local_6e0,0xff);
      uVar102 = auVar15._0_8_;
      local_a0._8_8_ = uVar102;
      local_a0._0_8_ = uVar102;
      local_a0._16_8_ = uVar102;
      local_a0._24_8_ = uVar102;
      auVar15 = vpermilps_avx(local_6f0,0xff);
      uVar102 = auVar15._0_8_;
      local_c0._8_8_ = uVar102;
      local_c0._0_8_ = uVar102;
      local_c0._16_8_ = uVar102;
      local_c0._24_8_ = uVar102;
      auVar15 = vpermilps_avx(_local_700,0xff);
      local_e0 = auVar15._0_8_;
      local_8c0 = auVar88._0_4_;
      fStack_8bc = auVar88._4_4_;
      fStack_8b8 = auVar88._8_4_;
      fStack_8b4 = auVar88._12_4_;
      fStack_8b0 = auVar88._16_4_;
      fStack_8ac = auVar88._20_4_;
      fStack_8a8 = auVar88._24_4_;
      fVar130 = auVar15._0_4_;
      fVar150 = auVar15._4_4_;
      auVar221._4_4_ = fVar150 * fStack_8bc;
      auVar221._0_4_ = fVar130 * local_8c0;
      auVar221._8_4_ = fVar130 * fStack_8b8;
      auVar221._12_4_ = fVar150 * fStack_8b4;
      auVar221._16_4_ = fVar130 * fStack_8b0;
      auVar221._20_4_ = fVar150 * fStack_8ac;
      auVar221._24_4_ = fVar130 * fStack_8a8;
      auVar221._28_4_ = local_540._0_4_;
      auVar15 = vfmadd231ps_fma(auVar221,local_c0,auVar142);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar139,local_a0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar204,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar176._4_4_ = fVar124 * fVar150;
      auVar176._0_4_ = fVar122 * fVar130;
      auVar176._8_4_ = fVar126 * fVar130;
      auVar176._12_4_ = fVar127 * fVar150;
      auVar176._16_4_ = fVar128 * fVar130;
      auVar176._20_4_ = fVar129 * fVar150;
      auVar176._24_4_ = fVar170 * fVar130;
      auVar176._28_4_ = auVar204._28_4_;
      auVar106 = vfmadd231ps_fma(auVar176,auVar166,local_c0);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar236,local_a0);
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar7,local_80);
      auVar233._4_4_ = fVar151 * fVar151;
      auVar233._0_4_ = fVar152 * fVar152;
      auVar233._8_4_ = fVar123 * fVar123;
      auVar233._12_4_ = fVar125 * fVar125;
      auVar233._16_4_ = fVar245 * fVar245;
      auVar233._20_4_ = fVar246 * fVar246;
      auVar233._24_4_ = fVar101 * fVar101;
      auVar233._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar233,auVar119,auVar119);
      auVar221 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar106));
      auVar16._4_4_ = auVar221._4_4_ * auVar221._4_4_ * auVar14._4_4_;
      auVar16._0_4_ = auVar221._0_4_ * auVar221._0_4_ * auVar14._0_4_;
      auVar16._8_4_ = auVar221._8_4_ * auVar221._8_4_ * auVar14._8_4_;
      auVar16._12_4_ = auVar221._12_4_ * auVar221._12_4_ * auVar14._12_4_;
      auVar16._16_4_ = auVar221._16_4_ * auVar221._16_4_ * 0.0;
      auVar16._20_4_ = auVar221._20_4_ * auVar221._20_4_ * 0.0;
      auVar16._24_4_ = auVar221._24_4_ * auVar221._24_4_ * 0.0;
      auVar16._28_4_ = auVar221._28_4_;
      auVar17._4_4_ = auVar112._4_4_ * auVar112._4_4_;
      auVar17._0_4_ = auVar112._0_4_ * auVar112._0_4_;
      auVar17._8_4_ = auVar112._8_4_ * auVar112._8_4_;
      auVar17._12_4_ = auVar112._12_4_ * auVar112._12_4_;
      auVar17._16_4_ = auVar112._16_4_ * auVar112._16_4_;
      auVar17._20_4_ = auVar112._20_4_ * auVar112._20_4_;
      auVar17._24_4_ = auVar112._24_4_ * auVar112._24_4_;
      auVar17._28_4_ = auVar112._28_4_;
      auVar221 = vcmpps_avx(auVar17,auVar16,2);
      fVar152 = auVar192._0_4_ * 4.7683716e-07;
      auVar113._0_4_ = (float)iVar91;
      _auStack_4fc = auVar133._4_12_;
      auVar113._4_4_ = auVar113._0_4_;
      auVar113._8_4_ = auVar113._0_4_;
      auVar113._12_4_ = auVar113._0_4_;
      auVar113._16_4_ = auVar113._0_4_;
      auVar113._20_4_ = auVar113._0_4_;
      auVar113._24_4_ = auVar113._0_4_;
      auVar113._28_4_ = auVar113._0_4_;
      auVar112 = vcmpps_avx(_DAT_02020f40,auVar113,1);
      auVar14 = vpermilps_avx(auVar153,0xaa);
      uVar102 = auVar14._0_8_;
      auVar175._8_8_ = uVar102;
      auVar175._0_8_ = uVar102;
      auVar175._16_8_ = uVar102;
      auVar175._24_8_ = uVar102;
      auVar180 = ZEXT3264(auVar175);
      auVar192 = vpermilps_avx(auVar132,0xaa);
      uVar102 = auVar192._0_8_;
      local_100._8_8_ = uVar102;
      local_100._0_8_ = uVar102;
      local_100._16_8_ = uVar102;
      local_100._24_8_ = uVar102;
      auVar192 = vpermilps_avx(auVar104,0xaa);
      uVar102 = auVar192._0_8_;
      local_540._8_8_ = uVar102;
      local_540._0_8_ = uVar102;
      local_540._16_8_ = uVar102;
      local_540._24_8_ = uVar102;
      auVar192 = vshufps_avx(auVar133,auVar133,0xaa);
      uVar102 = auVar192._0_8_;
      register0x00001508 = uVar102;
      local_740 = uVar102;
      register0x00001510 = uVar102;
      register0x00001518 = uVar102;
      auVar239 = ZEXT3264(_local_740);
      auVar176 = auVar112 & auVar221;
      uVar96 = *(uint *)(ray + k * 4 + 0x60);
      _local_620 = ZEXT416(uVar96);
      fVar151 = fVar171;
      fVar123 = fVar181;
      fVar125 = fVar171;
      fVar245 = fVar181;
      fVar246 = fVar171;
      uStack_778 = local_780;
      uStack_770 = local_780;
      uStack_768 = local_780;
      fStack_71c = local_720;
      fStack_718 = local_720;
      fStack_714 = local_720;
      fStack_710 = local_720;
      fStack_70c = local_720;
      fStack_708 = local_720;
      fStack_704 = local_720;
      local_500 = auVar113._0_4_;
      if ((((((((auVar176 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar176 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar176 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar176 >> 0x7f,0) == '\0') &&
            (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar176 >> 0xbf,0) == '\0') &&
          (auVar176 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar176[0x1f]) {
        auVar228 = ZEXT3264(auVar118);
        auVar222 = ZEXT3264(auVar110);
        auVar148 = ZEXT3264(local_660);
        auVar212 = ZEXT3264(local_760);
      }
      else {
        local_5a0 = SUB84(pGVar98,0);
        fStack_59c = (float)((ulong)pGVar98 >> 0x20);
        auVar221 = vandps_avx(auVar221,auVar112);
        fVar130 = auVar192._0_4_;
        fVar150 = auVar192._4_4_;
        auVar20._4_4_ = fVar150 * fVar124;
        auVar20._0_4_ = fVar130 * fVar122;
        auVar20._8_4_ = fVar130 * fVar126;
        auVar20._12_4_ = fVar150 * fVar127;
        auVar20._16_4_ = fVar130 * fVar128;
        auVar20._20_4_ = fVar150 * fVar129;
        auVar20._24_4_ = fVar130 * fVar170;
        auVar20._28_4_ = auVar221._28_4_;
        auVar192 = vfmadd213ps_fma(auVar166,local_540,auVar20);
        auVar192 = vfmadd213ps_fma(auVar236,local_100,ZEXT1632(auVar192));
        auVar192 = vfmadd213ps_fma(auVar7,auVar175,ZEXT1632(auVar192));
        auVar114._0_4_ = fVar130 * local_8c0;
        auVar114._4_4_ = fVar150 * fStack_8bc;
        auVar114._8_4_ = fVar130 * fStack_8b8;
        auVar114._12_4_ = fVar150 * fStack_8b4;
        auVar114._16_4_ = fVar130 * fStack_8b0;
        auVar114._20_4_ = fVar150 * fStack_8ac;
        auVar114._24_4_ = fVar130 * fStack_8a8;
        auVar114._28_4_ = 0;
        auVar105 = vfmadd213ps_fma(auVar142,local_540,auVar114);
        auVar105 = vfmadd213ps_fma(auVar139,local_100,ZEXT1632(auVar105));
        auVar142 = *(undefined1 (*) [32])(bspline_basis0 + lVar18 + 0x1210);
        auVar139 = *(undefined1 (*) [32])(bspline_basis0 + lVar18 + 0x1694);
        auVar166 = *(undefined1 (*) [32])(bspline_basis0 + lVar18 + 0x1b18);
        fVar101 = *(float *)(bspline_basis0 + lVar18 + 0x1f9c);
        fVar122 = *(float *)(bspline_basis0 + lVar18 + 0x1fa0);
        fVar124 = *(float *)(bspline_basis0 + lVar18 + 0x1fa4);
        fVar126 = *(float *)(bspline_basis0 + lVar18 + 0x1fa8);
        fVar127 = *(float *)(bspline_basis0 + lVar18 + 0x1fac);
        fVar128 = *(float *)(bspline_basis0 + lVar18 + 0x1fb0);
        fVar129 = *(float *)(bspline_basis0 + lVar18 + 0x1fb4);
        auVar200._0_4_ = local_720 * fVar101;
        auVar200._4_4_ = local_720 * fVar122;
        auVar200._8_4_ = local_720 * fVar124;
        auVar200._12_4_ = local_720 * fVar126;
        auVar200._16_4_ = local_720 * fVar127;
        auVar200._20_4_ = local_720 * fVar128;
        auVar200._24_4_ = local_720 * fVar129;
        auVar200._28_4_ = 0;
        auVar21._4_4_ = fVar181 * fVar122;
        auVar21._0_4_ = fVar171 * fVar101;
        auVar21._8_4_ = fVar171 * fVar124;
        auVar21._12_4_ = fVar181 * fVar126;
        auVar21._16_4_ = fVar171 * fVar127;
        auVar21._20_4_ = fVar181 * fVar128;
        auVar21._24_4_ = fVar171 * fVar129;
        auVar21._28_4_ = *(undefined4 *)(bspline_basis1 + lVar18 + 0xda8);
        auVar22._4_4_ = fVar122 * fVar150;
        auVar22._0_4_ = fVar101 * fVar130;
        auVar22._8_4_ = fVar124 * fVar130;
        auVar22._12_4_ = fVar126 * fVar150;
        auVar22._16_4_ = fVar127 * fVar130;
        auVar22._20_4_ = fVar128 * fVar150;
        auVar22._24_4_ = fVar129 * fVar130;
        auVar22._28_4_ = auVar119._28_4_;
        auVar153 = vfmadd231ps_fma(auVar200,auVar166,local_640);
        auVar132 = vfmadd231ps_fma(auVar21,auVar166,auVar207);
        auVar104 = vfmadd231ps_fma(auVar22,local_540,auVar166);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar139,local_760);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar139,local_660);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_100,auVar139);
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar142,auVar243);
        auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar142,local_4e0);
        auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar175,auVar142);
        fVar101 = *(float *)(bspline_basis1 + lVar18 + 0x1f9c);
        fVar122 = *(float *)(bspline_basis1 + lVar18 + 0x1fa0);
        fVar124 = *(float *)(bspline_basis1 + lVar18 + 0x1fa4);
        fVar126 = *(float *)(bspline_basis1 + lVar18 + 0x1fa8);
        fVar127 = *(float *)(bspline_basis1 + lVar18 + 0x1fac);
        fVar128 = *(float *)(bspline_basis1 + lVar18 + 0x1fb0);
        fVar129 = *(float *)(bspline_basis1 + lVar18 + 0x1fb4);
        auVar166._4_4_ = local_720 * fVar122;
        auVar166._0_4_ = local_720 * fVar101;
        auVar166._8_4_ = local_720 * fVar124;
        auVar166._12_4_ = local_720 * fVar126;
        auVar166._16_4_ = local_720 * fVar127;
        auVar166._20_4_ = local_720 * fVar128;
        auVar166._24_4_ = local_720 * fVar129;
        auVar166._28_4_ = local_720;
        auVar23._4_4_ = fVar181 * fVar122;
        auVar23._0_4_ = fVar171 * fVar101;
        auVar23._8_4_ = fVar171 * fVar124;
        auVar23._12_4_ = fVar181 * fVar126;
        auVar23._16_4_ = fVar171 * fVar127;
        auVar23._20_4_ = fVar181 * fVar128;
        auVar23._24_4_ = fVar171 * fVar129;
        auVar23._28_4_ = fVar181;
        auVar24._4_4_ = fVar122 * fVar150;
        auVar24._0_4_ = fVar101 * fVar130;
        auVar24._8_4_ = fVar124 * fVar130;
        auVar24._12_4_ = fVar126 * fVar150;
        auVar24._16_4_ = fVar127 * fVar130;
        auVar24._20_4_ = fVar128 * fVar150;
        auVar24._24_4_ = fVar129 * fVar130;
        auVar24._28_4_ = auVar14._4_4_;
        auVar142 = *(undefined1 (*) [32])(bspline_basis1 + lVar18 + 0x1b18);
        auVar14 = vfmadd231ps_fma(auVar166,auVar142,local_640);
        auVar133 = vfmadd231ps_fma(auVar23,auVar142,auVar207);
        auVar172 = vfmadd231ps_fma(auVar24,auVar142,local_540);
        auVar142 = *(undefined1 (*) [32])(bspline_basis1 + lVar18 + 0x1694);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar142,local_760);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar142,local_660);
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_100,auVar142);
        auVar142 = *(undefined1 (*) [32])(bspline_basis1 + lVar18 + 0x1210);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar142,auVar243);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar142,local_4e0);
        auVar136._8_4_ = 0x7fffffff;
        auVar136._0_8_ = 0x7fffffff7fffffff;
        auVar136._12_4_ = 0x7fffffff;
        auVar136._16_4_ = 0x7fffffff;
        auVar136._20_4_ = 0x7fffffff;
        auVar136._24_4_ = 0x7fffffff;
        auVar136._28_4_ = 0x7fffffff;
        auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar175,auVar142);
        auVar142 = vandps_avx(ZEXT1632(auVar153),auVar136);
        auVar139 = vandps_avx(ZEXT1632(auVar132),auVar136);
        auVar139 = vmaxps_avx(auVar142,auVar139);
        auVar142 = vandps_avx(ZEXT1632(auVar104),auVar136);
        auVar142 = vmaxps_avx(auVar139,auVar142);
        auVar164._4_4_ = fVar152;
        auVar164._0_4_ = fVar152;
        auVar164._8_4_ = fVar152;
        auVar164._12_4_ = fVar152;
        auVar164._16_4_ = fVar152;
        auVar164._20_4_ = fVar152;
        auVar164._24_4_ = fVar152;
        auVar164._28_4_ = fVar152;
        auVar142 = vcmpps_avx(auVar142,auVar164,1);
        auVar166 = vblendvps_avx(ZEXT1632(auVar153),auVar119,auVar142);
        auVar236 = vblendvps_avx(ZEXT1632(auVar132),local_340,auVar142);
        auVar142 = vandps_avx(ZEXT1632(auVar14),auVar136);
        auVar139 = vandps_avx(ZEXT1632(auVar133),auVar136);
        auVar7 = vmaxps_avx(auVar142,auVar139);
        auVar142 = vandps_avx(ZEXT1632(auVar172),auVar136);
        auVar142 = vmaxps_avx(auVar7,auVar142);
        auVar112 = vcmpps_avx(auVar142,auVar164,1);
        auVar142 = vblendvps_avx(ZEXT1632(auVar14),auVar119,auVar112);
        auVar7 = vblendvps_avx(ZEXT1632(auVar133),local_340,auVar112);
        auVar14 = vfmadd213ps_fma(auVar204,auVar175,ZEXT1632(auVar105));
        auVar105 = vfmadd213ps_fma(auVar166,auVar166,ZEXT832(0) << 0x20);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar236,auVar236);
        auVar204 = vrsqrtps_avx(ZEXT1632(auVar105));
        fVar101 = auVar204._0_4_;
        fVar122 = auVar204._4_4_;
        fVar124 = auVar204._8_4_;
        fVar126 = auVar204._12_4_;
        fVar127 = auVar204._16_4_;
        fVar128 = auVar204._20_4_;
        fVar129 = auVar204._24_4_;
        auVar119._4_4_ = fVar122 * fVar122 * fVar122 * auVar105._4_4_ * -0.5;
        auVar119._0_4_ = fVar101 * fVar101 * fVar101 * auVar105._0_4_ * -0.5;
        auVar119._8_4_ = fVar124 * fVar124 * fVar124 * auVar105._8_4_ * -0.5;
        auVar119._12_4_ = fVar126 * fVar126 * fVar126 * auVar105._12_4_ * -0.5;
        auVar119._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar119._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar119._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar119._28_4_ = 0;
        auVar195._8_4_ = 0x3fc00000;
        auVar195._0_8_ = 0x3fc000003fc00000;
        auVar195._12_4_ = 0x3fc00000;
        auVar195._16_4_ = 0x3fc00000;
        auVar195._20_4_ = 0x3fc00000;
        auVar195._24_4_ = 0x3fc00000;
        auVar195._28_4_ = 0x3fc00000;
        auVar105 = vfmadd231ps_fma(auVar119,auVar195,auVar204);
        fVar101 = auVar105._0_4_;
        fVar122 = auVar105._4_4_;
        auVar25._4_4_ = auVar236._4_4_ * fVar122;
        auVar25._0_4_ = auVar236._0_4_ * fVar101;
        fVar124 = auVar105._8_4_;
        auVar25._8_4_ = auVar236._8_4_ * fVar124;
        fVar126 = auVar105._12_4_;
        auVar25._12_4_ = auVar236._12_4_ * fVar126;
        auVar25._16_4_ = auVar236._16_4_ * 0.0;
        auVar25._20_4_ = auVar236._20_4_ * 0.0;
        auVar25._24_4_ = auVar236._24_4_ * 0.0;
        auVar25._28_4_ = auVar204._28_4_;
        auVar26._4_4_ = -auVar166._4_4_ * fVar122;
        auVar26._0_4_ = -auVar166._0_4_ * fVar101;
        auVar26._8_4_ = -auVar166._8_4_ * fVar124;
        auVar26._12_4_ = -auVar166._12_4_ * fVar126;
        auVar26._16_4_ = -auVar166._16_4_ * 0.0;
        auVar26._20_4_ = -auVar166._20_4_ * 0.0;
        auVar26._24_4_ = -auVar166._24_4_ * 0.0;
        auVar26._28_4_ = auVar139._28_4_;
        auVar105 = vfmadd213ps_fma(auVar142,auVar142,ZEXT832(0) << 0x20);
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar7,auVar7);
        auVar139 = vrsqrtps_avx(ZEXT1632(auVar105));
        auVar27._28_4_ = auVar112._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * 0.0,
                                CONCAT48(fVar124 * 0.0,CONCAT44(fVar122 * 0.0,fVar101 * 0.0))));
        fVar101 = auVar139._0_4_;
        fVar122 = auVar139._4_4_;
        fVar124 = auVar139._8_4_;
        fVar126 = auVar139._12_4_;
        fVar127 = auVar139._16_4_;
        fVar128 = auVar139._20_4_;
        fVar129 = auVar139._24_4_;
        auVar28._4_4_ = fVar122 * fVar122 * fVar122 * auVar105._4_4_ * -0.5;
        auVar28._0_4_ = fVar101 * fVar101 * fVar101 * auVar105._0_4_ * -0.5;
        auVar28._8_4_ = fVar124 * fVar124 * fVar124 * auVar105._8_4_ * -0.5;
        auVar28._12_4_ = fVar126 * fVar126 * fVar126 * auVar105._12_4_ * -0.5;
        auVar28._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar28._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar28._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar28._28_4_ = 0;
        auVar105 = vfmadd231ps_fma(auVar28,auVar195,auVar139);
        fVar101 = auVar105._0_4_;
        fVar122 = auVar105._4_4_;
        auVar29._4_4_ = auVar7._4_4_ * fVar122;
        auVar29._0_4_ = auVar7._0_4_ * fVar101;
        fVar124 = auVar105._8_4_;
        auVar29._8_4_ = auVar7._8_4_ * fVar124;
        fVar126 = auVar105._12_4_;
        auVar29._12_4_ = auVar7._12_4_ * fVar126;
        auVar29._16_4_ = auVar7._16_4_ * 0.0;
        auVar29._20_4_ = auVar7._20_4_ * 0.0;
        auVar29._24_4_ = auVar7._24_4_ * 0.0;
        auVar29._28_4_ = 0;
        auVar30._4_4_ = -auVar142._4_4_ * fVar122;
        auVar30._0_4_ = -auVar142._0_4_ * fVar101;
        auVar30._8_4_ = -auVar142._8_4_ * fVar124;
        auVar30._12_4_ = -auVar142._12_4_ * fVar126;
        auVar30._16_4_ = -auVar142._16_4_ * 0.0;
        auVar30._20_4_ = -auVar142._20_4_ * 0.0;
        auVar30._24_4_ = -auVar142._24_4_ * 0.0;
        auVar30._28_4_ = auVar7._28_4_;
        auVar142._28_4_ = auVar139._28_4_;
        auVar142._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * 0.0,
                                CONCAT48(fVar124 * 0.0,CONCAT44(fVar122 * 0.0,fVar101 * 0.0))));
        auVar105 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar15),auVar134);
        auVar139 = ZEXT1632(auVar15);
        auVar153 = vfmadd213ps_fma(auVar26,auVar139,local_320);
        auVar132 = vfmadd213ps_fma(auVar27,auVar139,ZEXT1632(auVar14));
        auVar172 = vfnmadd213ps_fma(auVar25,auVar139,auVar134);
        auVar104 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar106),auVar111);
        auVar183 = vfnmadd213ps_fma(auVar26,auVar139,local_320);
        auVar139 = ZEXT1632(auVar106);
        auVar133 = vfmadd213ps_fma(auVar30,auVar139,local_300);
        auVar135 = ZEXT1632(auVar15);
        auVar182 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar135,auVar27);
        auVar14 = vfmadd213ps_fma(auVar142,auVar139,ZEXT1632(auVar192));
        auVar103 = vfnmadd213ps_fma(auVar29,auVar139,auVar111);
        auVar131 = vfnmadd213ps_fma(auVar30,auVar139,local_300);
        auVar197 = vfnmadd231ps_fma(ZEXT1632(auVar192),ZEXT1632(auVar106),auVar142);
        auVar142 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar183));
        auVar139 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar182));
        auVar111._4_4_ = auVar182._4_4_ * auVar142._4_4_;
        auVar111._0_4_ = auVar182._0_4_ * auVar142._0_4_;
        auVar111._8_4_ = auVar182._8_4_ * auVar142._8_4_;
        auVar111._12_4_ = auVar182._12_4_ * auVar142._12_4_;
        auVar111._16_4_ = auVar142._16_4_ * 0.0;
        auVar111._20_4_ = auVar142._20_4_ * 0.0;
        auVar111._24_4_ = auVar142._24_4_ * 0.0;
        auVar111._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar111,ZEXT1632(auVar183),auVar139);
        auVar134._4_4_ = auVar172._4_4_ * auVar139._4_4_;
        auVar134._0_4_ = auVar172._0_4_ * auVar139._0_4_;
        auVar134._8_4_ = auVar172._8_4_ * auVar139._8_4_;
        auVar134._12_4_ = auVar172._12_4_ * auVar139._12_4_;
        auVar134._16_4_ = auVar139._16_4_ * 0.0;
        auVar134._20_4_ = auVar139._20_4_ * 0.0;
        auVar134._24_4_ = auVar139._24_4_ * 0.0;
        auVar134._28_4_ = auVar139._28_4_;
        auVar112 = ZEXT1632(auVar172);
        auVar139 = vsubps_avx(ZEXT1632(auVar104),auVar112);
        auVar192 = vfmsub231ps_fma(auVar134,ZEXT1632(auVar182),auVar139);
        auVar31._4_4_ = auVar183._4_4_ * auVar139._4_4_;
        auVar31._0_4_ = auVar183._0_4_ * auVar139._0_4_;
        auVar31._8_4_ = auVar183._8_4_ * auVar139._8_4_;
        auVar31._12_4_ = auVar183._12_4_ * auVar139._12_4_;
        auVar31._16_4_ = auVar139._16_4_ * 0.0;
        auVar31._20_4_ = auVar139._20_4_ * 0.0;
        auVar31._24_4_ = auVar139._24_4_ * 0.0;
        auVar31._28_4_ = auVar139._28_4_;
        auVar172 = vfmsub231ps_fma(auVar31,auVar112,auVar142);
        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar172),ZEXT832(0) << 0x20,ZEXT1632(auVar192));
        auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar176 = vcmpps_avx(ZEXT1632(auVar192),ZEXT832(0) << 0x20,2);
        auVar180 = ZEXT3264(auVar176);
        auVar142 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar105),auVar176);
        auVar139 = vblendvps_avx(ZEXT1632(auVar131),ZEXT1632(auVar153),auVar176);
        auVar204 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar132),auVar176);
        auVar166 = vblendvps_avx(auVar112,ZEXT1632(auVar104),auVar176);
        auVar236 = vblendvps_avx(ZEXT1632(auVar183),ZEXT1632(auVar133),auVar176);
        auVar7 = vblendvps_avx(ZEXT1632(auVar182),ZEXT1632(auVar14),auVar176);
        auVar112 = vblendvps_avx(ZEXT1632(auVar104),auVar112,auVar176);
        auVar119 = vblendvps_avx(ZEXT1632(auVar133),ZEXT1632(auVar183),auVar176);
        auVar192 = vpackssdw_avx(auVar221._0_16_,auVar221._16_16_);
        auVar221 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar182),auVar176);
        auVar233 = vsubps_avx(auVar112,auVar142);
        auVar119 = vsubps_avx(auVar119,auVar139);
        auVar16 = vsubps_avx(auVar221,auVar204);
        auVar17 = vsubps_avx(auVar142,auVar166);
        auVar111 = vsubps_avx(auVar139,auVar236);
        auVar134 = vsubps_avx(auVar204,auVar7);
        auVar32._4_4_ = auVar16._4_4_ * auVar142._4_4_;
        auVar32._0_4_ = auVar16._0_4_ * auVar142._0_4_;
        auVar32._8_4_ = auVar16._8_4_ * auVar142._8_4_;
        auVar32._12_4_ = auVar16._12_4_ * auVar142._12_4_;
        auVar32._16_4_ = auVar16._16_4_ * auVar142._16_4_;
        auVar32._20_4_ = auVar16._20_4_ * auVar142._20_4_;
        auVar32._24_4_ = auVar16._24_4_ * auVar142._24_4_;
        auVar32._28_4_ = auVar221._28_4_;
        auVar14 = vfmsub231ps_fma(auVar32,auVar204,auVar233);
        auVar33._4_4_ = auVar233._4_4_ * auVar139._4_4_;
        auVar33._0_4_ = auVar233._0_4_ * auVar139._0_4_;
        auVar33._8_4_ = auVar233._8_4_ * auVar139._8_4_;
        auVar33._12_4_ = auVar233._12_4_ * auVar139._12_4_;
        auVar33._16_4_ = auVar233._16_4_ * auVar139._16_4_;
        auVar33._20_4_ = auVar233._20_4_ * auVar139._20_4_;
        auVar33._24_4_ = auVar233._24_4_ * auVar139._24_4_;
        auVar33._28_4_ = auVar112._28_4_;
        auVar15 = vfmsub231ps_fma(auVar33,auVar142,auVar119);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar115._0_4_ = auVar119._0_4_ * auVar204._0_4_;
        auVar115._4_4_ = auVar119._4_4_ * auVar204._4_4_;
        auVar115._8_4_ = auVar119._8_4_ * auVar204._8_4_;
        auVar115._12_4_ = auVar119._12_4_ * auVar204._12_4_;
        auVar115._16_4_ = auVar119._16_4_ * auVar204._16_4_;
        auVar115._20_4_ = auVar119._20_4_ * auVar204._20_4_;
        auVar115._24_4_ = auVar119._24_4_ * auVar204._24_4_;
        auVar115._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar115,auVar139,auVar16);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar116._0_4_ = auVar134._0_4_ * auVar166._0_4_;
        auVar116._4_4_ = auVar134._4_4_ * auVar166._4_4_;
        auVar116._8_4_ = auVar134._8_4_ * auVar166._8_4_;
        auVar116._12_4_ = auVar134._12_4_ * auVar166._12_4_;
        auVar116._16_4_ = auVar134._16_4_ * auVar166._16_4_;
        auVar116._20_4_ = auVar134._20_4_ * auVar166._20_4_;
        auVar116._24_4_ = auVar134._24_4_ * auVar166._24_4_;
        auVar116._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar116,auVar17,auVar7);
        auVar34._4_4_ = auVar111._4_4_ * auVar7._4_4_;
        auVar34._0_4_ = auVar111._0_4_ * auVar7._0_4_;
        auVar34._8_4_ = auVar111._8_4_ * auVar7._8_4_;
        auVar34._12_4_ = auVar111._12_4_ * auVar7._12_4_;
        auVar34._16_4_ = auVar111._16_4_ * auVar7._16_4_;
        auVar34._20_4_ = auVar111._20_4_ * auVar7._20_4_;
        auVar34._24_4_ = auVar111._24_4_ * auVar7._24_4_;
        auVar34._28_4_ = auVar7._28_4_;
        auVar105 = vfmsub231ps_fma(auVar34,auVar236,auVar134);
        auVar35._4_4_ = auVar17._4_4_ * auVar236._4_4_;
        auVar35._0_4_ = auVar17._0_4_ * auVar236._0_4_;
        auVar35._8_4_ = auVar17._8_4_ * auVar236._8_4_;
        auVar35._12_4_ = auVar17._12_4_ * auVar236._12_4_;
        auVar35._16_4_ = auVar17._16_4_ * auVar236._16_4_;
        auVar35._20_4_ = auVar17._20_4_ * auVar236._20_4_;
        auVar35._24_4_ = auVar17._24_4_ * auVar236._24_4_;
        auVar35._28_4_ = auVar236._28_4_;
        auVar153 = vfmsub231ps_fma(auVar35,auVar111,auVar166);
        auVar236 = ZEXT832(0) << 0x20;
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar153),auVar236,ZEXT1632(auVar14));
        auVar105 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar236,ZEXT1632(auVar105));
        auVar166 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar105));
        auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
        auVar14 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
        auVar192 = vpand_avx(auVar192,auVar14);
        auVar166 = vpmovsxwd_avx2(auVar192);
        if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar166 >> 0x7f,0) == '\0') &&
              (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar166 >> 0xbf,0) == '\0') &&
            (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar166[0x1f]) {
LAB_01678c70:
          auVar212 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar228 = ZEXT3264(auVar118);
          auVar222 = ZEXT3264(auVar110);
        }
        else {
          auVar36._4_4_ = auVar119._4_4_ * auVar134._4_4_;
          auVar36._0_4_ = auVar119._0_4_ * auVar134._0_4_;
          auVar36._8_4_ = auVar119._8_4_ * auVar134._8_4_;
          auVar36._12_4_ = auVar119._12_4_ * auVar134._12_4_;
          auVar36._16_4_ = auVar119._16_4_ * auVar134._16_4_;
          auVar36._20_4_ = auVar119._20_4_ * auVar134._20_4_;
          auVar36._24_4_ = auVar119._24_4_ * auVar134._24_4_;
          auVar36._28_4_ = auVar166._28_4_;
          auVar104 = vfmsub231ps_fma(auVar36,auVar111,auVar16);
          auVar137._0_4_ = auVar17._0_4_ * auVar16._0_4_;
          auVar137._4_4_ = auVar17._4_4_ * auVar16._4_4_;
          auVar137._8_4_ = auVar17._8_4_ * auVar16._8_4_;
          auVar137._12_4_ = auVar17._12_4_ * auVar16._12_4_;
          auVar137._16_4_ = auVar17._16_4_ * auVar16._16_4_;
          auVar137._20_4_ = auVar17._20_4_ * auVar16._20_4_;
          auVar137._24_4_ = auVar17._24_4_ * auVar16._24_4_;
          auVar137._28_4_ = 0;
          auVar132 = vfmsub231ps_fma(auVar137,auVar233,auVar134);
          auVar37._4_4_ = auVar233._4_4_ * auVar111._4_4_;
          auVar37._0_4_ = auVar233._0_4_ * auVar111._0_4_;
          auVar37._8_4_ = auVar233._8_4_ * auVar111._8_4_;
          auVar37._12_4_ = auVar233._12_4_ * auVar111._12_4_;
          auVar37._16_4_ = auVar233._16_4_ * auVar111._16_4_;
          auVar37._20_4_ = auVar233._20_4_ * auVar111._20_4_;
          auVar37._24_4_ = auVar233._24_4_ * auVar111._24_4_;
          auVar37._28_4_ = auVar233._28_4_;
          auVar133 = vfmsub231ps_fma(auVar37,auVar17,auVar119);
          auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar132),ZEXT1632(auVar133));
          auVar153 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar104),auVar236);
          auVar166 = vrcpps_avx(ZEXT1632(auVar153));
          auVar232._8_4_ = 0x3f800000;
          auVar232._0_8_ = &DAT_3f8000003f800000;
          auVar232._12_4_ = 0x3f800000;
          auVar232._16_4_ = 0x3f800000;
          auVar232._20_4_ = 0x3f800000;
          auVar232._24_4_ = 0x3f800000;
          auVar232._28_4_ = 0x3f800000;
          auVar14 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar153),auVar232);
          auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar166,auVar166);
          auVar38._4_4_ = auVar133._4_4_ * auVar204._4_4_;
          auVar38._0_4_ = auVar133._0_4_ * auVar204._0_4_;
          auVar38._8_4_ = auVar133._8_4_ * auVar204._8_4_;
          auVar38._12_4_ = auVar133._12_4_ * auVar204._12_4_;
          auVar38._16_4_ = auVar204._16_4_ * 0.0;
          auVar38._20_4_ = auVar204._20_4_ * 0.0;
          auVar38._24_4_ = auVar204._24_4_ * 0.0;
          auVar38._28_4_ = auVar204._28_4_;
          auVar132 = vfmadd231ps_fma(auVar38,auVar139,ZEXT1632(auVar132));
          auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT1632(auVar104),auVar142);
          fVar101 = auVar14._0_4_;
          fVar122 = auVar14._4_4_;
          fVar124 = auVar14._8_4_;
          fVar126 = auVar14._12_4_;
          auVar39._28_4_ = auVar139._28_4_;
          auVar39._0_28_ =
               ZEXT1628(CONCAT412(fVar126 * auVar132._12_4_,
                                  CONCAT48(fVar124 * auVar132._8_4_,
                                           CONCAT44(fVar122 * auVar132._4_4_,
                                                    fVar101 * auVar132._0_4_))));
          auVar117._4_4_ = uVar96;
          auVar117._0_4_ = uVar96;
          auVar117._8_4_ = uVar96;
          auVar117._12_4_ = uVar96;
          auVar117._16_4_ = uVar96;
          auVar117._20_4_ = uVar96;
          auVar117._24_4_ = uVar96;
          auVar117._28_4_ = uVar96;
          uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar138._4_4_ = uVar229;
          auVar138._0_4_ = uVar229;
          auVar138._8_4_ = uVar229;
          auVar138._12_4_ = uVar229;
          auVar138._16_4_ = uVar229;
          auVar138._20_4_ = uVar229;
          auVar138._24_4_ = uVar229;
          auVar138._28_4_ = uVar229;
          auVar142 = vcmpps_avx(auVar117,auVar39,2);
          auVar139 = vcmpps_avx(auVar39,auVar138,2);
          auVar142 = vandps_avx(auVar139,auVar142);
          auVar14 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar192 = vpand_avx(auVar192,auVar14);
          auVar142 = vpmovsxwd_avx2(auVar192);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) goto LAB_01678c70;
          auVar142 = vcmpps_avx(auVar236,ZEXT1632(auVar153),4);
          auVar14 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar192 = vpand_avx(auVar192,auVar14);
          auVar142 = vpmovsxwd_avx2(auVar192);
          auVar212 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar228 = ZEXT3264(auVar118);
          auVar222 = ZEXT3264(auVar110);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar126 * auVar15._12_4_,
                                          CONCAT48(fVar124 * auVar15._8_4_,
                                                   CONCAT44(fVar122 * auVar15._4_4_,
                                                            fVar101 * auVar15._0_4_))));
            auVar139 = ZEXT1632(CONCAT412(fVar126 * auVar105._12_4_,
                                          CONCAT48(fVar124 * auVar105._8_4_,
                                                   CONCAT44(fVar122 * auVar105._4_4_,
                                                            fVar101 * auVar105._0_4_))));
            auVar196._8_4_ = 0x3f800000;
            auVar196._0_8_ = &DAT_3f8000003f800000;
            auVar196._12_4_ = 0x3f800000;
            auVar196._16_4_ = 0x3f800000;
            auVar196._20_4_ = 0x3f800000;
            auVar196._24_4_ = 0x3f800000;
            auVar196._28_4_ = 0x3f800000;
            auVar110 = vsubps_avx(auVar196,auVar118);
            auVar110 = vblendvps_avx(auVar110,auVar118,auVar176);
            auVar228 = ZEXT3264(auVar110);
            auVar110 = vsubps_avx(auVar196,auVar139);
            local_360 = vblendvps_avx(auVar110,auVar139,auVar176);
            auVar212 = ZEXT3264(auVar142);
            auVar222 = ZEXT3264(auVar39);
          }
        }
        auVar239 = ZEXT3264(_local_740);
        auVar148 = ZEXT3264(auVar175);
        auVar110 = auVar212._0_32_;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0x7f,0) != '\0') ||
              (auVar212 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar110 >> 0xbf,0) != '\0') ||
            (auVar212 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar212[0x1f] < '\0') {
          auVar118 = vsubps_avx(ZEXT1632(auVar106),auVar135);
          auVar204 = auVar228._0_32_;
          auVar192 = vfmadd213ps_fma(auVar118,auVar204,auVar135);
          fVar101 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar118._4_4_ = (auVar192._4_4_ + auVar192._4_4_) * fVar101;
          auVar118._0_4_ = (auVar192._0_4_ + auVar192._0_4_) * fVar101;
          auVar118._8_4_ = (auVar192._8_4_ + auVar192._8_4_) * fVar101;
          auVar118._12_4_ = (auVar192._12_4_ + auVar192._12_4_) * fVar101;
          auVar118._16_4_ = fVar101 * 0.0;
          auVar118._20_4_ = fVar101 * 0.0;
          auVar118._24_4_ = fVar101 * 0.0;
          auVar118._28_4_ = 0;
          auVar139 = auVar222._0_32_;
          auVar118 = vcmpps_avx(auVar139,auVar118,6);
          auVar142 = auVar110 & auVar118;
          auVar212 = ZEXT3264(local_760);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar142 >> 0x7f,0) != '\0') ||
                (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0xbf,0) != '\0') ||
              (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar142[0x1f] < '\0') {
            local_400 = vandps_avx(auVar118,auVar110);
            auVar140._8_4_ = 0xbf800000;
            auVar140._0_8_ = 0xbf800000bf800000;
            auVar140._12_4_ = 0xbf800000;
            auVar140._16_4_ = 0xbf800000;
            auVar140._20_4_ = 0xbf800000;
            auVar140._24_4_ = 0xbf800000;
            auVar140._28_4_ = 0xbf800000;
            auVar165._8_4_ = 0x40000000;
            auVar165._0_8_ = 0x4000000040000000;
            auVar165._12_4_ = 0x40000000;
            auVar165._16_4_ = 0x40000000;
            auVar165._20_4_ = 0x40000000;
            auVar165._24_4_ = 0x40000000;
            auVar165._28_4_ = 0x40000000;
            auVar192 = vfmadd213ps_fma(local_360,auVar165,auVar140);
            auVar180 = ZEXT1664(auVar192);
            local_4a0 = ZEXT1632(auVar192);
            local_360 = local_4a0;
            auVar110 = local_360;
            local_460 = 0;
            local_440 = local_6e0._0_8_;
            uStack_438 = local_6e0._8_8_;
            local_430 = local_6f0._0_8_;
            uStack_428 = local_6f0._8_8_;
            local_420 = local_700;
            uStack_418 = uStack_6f8;
            local_360 = auVar110;
            if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar151 = 1.0 / auVar113._0_4_;
              local_3e0[0] = fVar151 * (auVar228._0_4_ + 0.0);
              local_3e0[1] = fVar151 * (auVar228._4_4_ + 1.0);
              local_3e0[2] = fVar151 * (auVar228._8_4_ + 2.0);
              local_3e0[3] = fVar151 * (auVar228._12_4_ + 3.0);
              fStack_3d0 = fVar151 * (auVar228._16_4_ + 4.0);
              fStack_3cc = fVar151 * (auVar228._20_4_ + 5.0);
              fStack_3c8 = fVar151 * (auVar228._24_4_ + 6.0);
              fStack_3c4 = auVar228._28_4_ + 7.0;
              local_360._0_8_ = auVar192._0_8_;
              local_360._8_8_ = auVar192._8_8_;
              local_3c0 = local_360._0_8_;
              uStack_3b8 = local_360._8_8_;
              uStack_3b0 = 0;
              uStack_3a8 = 0;
              local_3a0 = auVar139;
              auVar141._8_4_ = 0x7f800000;
              auVar141._0_8_ = 0x7f8000007f800000;
              auVar141._12_4_ = 0x7f800000;
              auVar141._16_4_ = 0x7f800000;
              auVar141._20_4_ = 0x7f800000;
              auVar141._24_4_ = 0x7f800000;
              auVar141._28_4_ = 0x7f800000;
              auVar110 = vblendvps_avx(auVar141,auVar139,local_400);
              auVar118 = vshufps_avx(auVar110,auVar110,0xb1);
              auVar118 = vminps_avx(auVar110,auVar118);
              auVar142 = vshufpd_avx(auVar118,auVar118,5);
              auVar118 = vminps_avx(auVar118,auVar142);
              auVar142 = vpermpd_avx2(auVar118,0x4e);
              auVar118 = vminps_avx(auVar118,auVar142);
              auVar118 = vcmpps_avx(auVar110,auVar118,0);
              auVar142 = local_400 & auVar118;
              auVar110 = local_400;
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar118,local_400);
              }
              uVar92 = vmovmskps_avx(auVar110);
              uVar96 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar96 = uVar96 + 1;
              }
              uVar93 = (ulong)uVar96;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar98->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar151 = local_3e0[uVar93];
                uVar229 = *(undefined4 *)((long)&local_3c0 + uVar93 * 4);
                fVar123 = 1.0 - fVar151;
                auVar187 = ZEXT416((uint)(fVar151 * fVar123 * 4.0));
                auVar192 = vfnmsub213ss_fma(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),auVar187);
                auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar123),ZEXT416((uint)fVar123),auVar187);
                fVar123 = fVar123 * -fVar123 * 0.5;
                fVar125 = auVar192._0_4_ * 0.5;
                fVar245 = auVar187._0_4_ * 0.5;
                fVar246 = fVar151 * fVar151 * 0.5;
                auVar185._0_4_ = fVar246 * (float)local_700._0_4_;
                auVar185._4_4_ = fVar246 * (float)local_700._4_4_;
                auVar185._8_4_ = fVar246 * (float)uStack_6f8;
                auVar185._12_4_ = fVar246 * uStack_6f8._4_4_;
                auVar154._4_4_ = fVar245;
                auVar154._0_4_ = fVar245;
                auVar154._8_4_ = fVar245;
                auVar154._12_4_ = fVar245;
                auVar187 = vfmadd132ps_fma(auVar154,auVar185,local_6f0);
                auVar186._4_4_ = fVar125;
                auVar186._0_4_ = fVar125;
                auVar186._8_4_ = fVar125;
                auVar186._12_4_ = fVar125;
                auVar187 = vfmadd132ps_fma(auVar186,auVar187,local_6e0);
                auVar155._4_4_ = fVar123;
                auVar155._0_4_ = fVar123;
                auVar155._8_4_ = fVar123;
                auVar155._12_4_ = fVar123;
                auVar187 = vfmadd132ps_fma(auVar155,auVar187,*(undefined1 (*) [16])pPVar1);
                auVar180 = ZEXT464(*(uint *)(local_3a0 + uVar93 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar93 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar187._0_4_;
                uVar9 = vextractps_avx(auVar187,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                uVar9 = vextractps_avx(auVar187,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                *(float *)(ray + k * 4 + 0x1e0) = fVar151;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar229;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                *(uint *)(ray + k * 4 + 0x240) = uVar94;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_880 = CONCAT44(uVar94,uVar94);
                uStack_878._0_4_ = uVar94;
                uStack_878._4_4_ = uVar94;
                uStack_870._0_4_ = uVar94;
                uStack_870._4_4_ = uVar94;
                auVar90 = _local_880;
                uStack_868._0_4_ = uVar94;
                uStack_868._4_4_ = uVar94;
                auVar110 = _local_880;
                local_680._4_4_ = uVar4;
                local_680._0_4_ = uVar4;
                local_680._8_4_ = uVar4;
                local_680._12_4_ = uVar4;
                local_680._16_4_ = uVar4;
                local_680._20_4_ = uVar4;
                local_680._24_4_ = uVar4;
                local_680._28_4_ = uVar4;
                local_6a0 = ZEXT1632(local_6e0);
                local_560 = ZEXT1632(local_6f0);
                _local_580 = ZEXT1632(_local_700);
                local_6c0 = auVar175;
                local_600 = local_400;
                local_4c0 = auVar204;
                local_480 = auVar139;
                local_45c = iVar91;
                local_450 = uVar80;
                uStack_448 = uVar81;
                do {
                  uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar151 = local_3e0[uVar93];
                  auVar109._4_4_ = fVar151;
                  auVar109._0_4_ = fVar151;
                  auVar109._8_4_ = fVar151;
                  auVar109._12_4_ = fVar151;
                  local_240._16_4_ = fVar151;
                  local_240._0_16_ = auVar109;
                  local_240._20_4_ = fVar151;
                  local_240._24_4_ = fVar151;
                  local_240._28_4_ = fVar151;
                  uVar9 = *(undefined4 *)((long)&local_3c0 + uVar93 * 4);
                  local_220._4_4_ = uVar9;
                  local_220._0_4_ = uVar9;
                  local_220._8_4_ = uVar9;
                  local_220._12_4_ = uVar9;
                  local_220._16_4_ = uVar9;
                  local_220._20_4_ = uVar9;
                  local_220._24_4_ = uVar9;
                  local_220._28_4_ = uVar9;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar93 * 4);
                  fVar125 = 1.0 - fVar151;
                  auVar192 = ZEXT416((uint)(fVar151 * fVar125 * 4.0));
                  auVar14 = vfnmsub213ss_fma(auVar109,auVar109,auVar192);
                  auVar192 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar192)
                  ;
                  fVar123 = auVar192._0_4_ * 0.5;
                  fVar151 = fVar151 * fVar151 * 0.5;
                  auVar193._0_4_ = fVar151 * (float)local_580._0_4_;
                  auVar193._4_4_ = fVar151 * (float)local_580._4_4_;
                  auVar193._8_4_ = fVar151 * fStack_578;
                  auVar193._12_4_ = fVar151 * fStack_574;
                  auVar161._4_4_ = fVar123;
                  auVar161._0_4_ = fVar123;
                  auVar161._8_4_ = fVar123;
                  auVar161._12_4_ = fVar123;
                  auVar192 = vfmadd132ps_fma(auVar161,auVar193,local_560._0_16_);
                  fVar151 = auVar14._0_4_ * 0.5;
                  auVar194._4_4_ = fVar151;
                  auVar194._0_4_ = fVar151;
                  auVar194._8_4_ = fVar151;
                  auVar194._12_4_ = fVar151;
                  auVar192 = vfmadd132ps_fma(auVar194,auVar192,local_6a0._0_16_);
                  local_7b0.context = context->user;
                  fVar151 = fVar125 * -fVar125 * 0.5;
                  auVar162._4_4_ = fVar151;
                  auVar162._0_4_ = fVar151;
                  auVar162._8_4_ = fVar151;
                  auVar162._12_4_ = fVar151;
                  auVar14 = vfmadd132ps_fma(auVar162,auVar192,auVar187);
                  local_2a0 = auVar14._0_4_;
                  uStack_29c = local_2a0;
                  uStack_298 = local_2a0;
                  uStack_294 = local_2a0;
                  uStack_290 = local_2a0;
                  uStack_28c = local_2a0;
                  uStack_288 = local_2a0;
                  uStack_284 = local_2a0;
                  auVar192 = vmovshdup_avx(auVar14);
                  auVar174._0_8_ = auVar192._0_8_;
                  auVar174._8_8_ = auVar174._0_8_;
                  local_280._16_8_ = auVar174._0_8_;
                  local_280._0_16_ = auVar174;
                  local_280._24_8_ = auVar174._0_8_;
                  auVar180 = ZEXT3264(local_280);
                  auVar192 = vshufps_avx(auVar14,auVar14,0xaa);
                  auVar163._0_8_ = auVar192._0_8_;
                  auVar163._8_8_ = auVar163._0_8_;
                  auVar169._16_8_ = auVar163._0_8_;
                  auVar169._0_16_ = auVar163;
                  auVar169._24_8_ = auVar163._0_8_;
                  local_260 = auVar169;
                  local_200 = local_680._0_8_;
                  uStack_1f8 = local_680._8_8_;
                  uStack_1f0 = local_680._16_8_;
                  uStack_1e8 = local_680._24_8_;
                  uStack_870 = auVar90._16_8_;
                  uStack_868 = auVar110._24_8_;
                  local_1e0 = local_880;
                  uStack_1d8 = uStack_878;
                  uStack_1d0 = uStack_870;
                  uStack_1c8 = uStack_868;
                  auVar118 = vpcmpeqd_avx2(local_220,local_220);
                  local_6c8[1] = auVar118;
                  *local_6c8 = auVar118;
                  local_1c0 = (local_7b0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_7b0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_5e0 = local_2c0._0_8_;
                  uStack_5d8 = local_2c0._8_8_;
                  uStack_5d0 = local_2c0._16_8_;
                  uStack_5c8 = local_2c0._24_8_;
                  local_7b0.valid = (int *)&local_5e0;
                  local_7b0.geometryUserPtr = *(void **)(CONCAT44(fStack_59c,local_5a0) + 0x18);
                  local_7b0.hit = (RTCHitN *)&local_2a0;
                  local_7b0.N = 8;
                  pcVar11 = *(code **)(CONCAT44(fStack_59c,local_5a0) + 0x40);
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pcVar11 != (code *)0x0) {
                    auVar169 = ZEXT1632(auVar163);
                    auVar180 = ZEXT1664(auVar174);
                    (*pcVar11)(&local_7b0);
                    auVar149._8_56_ = extraout_var_00;
                    auVar149._0_8_ = extraout_XMM1_Qa_00;
                    auVar239 = ZEXT3264(_local_740);
                    auVar148 = ZEXT3264(local_6c0);
                    auVar212 = ZEXT3264(local_760);
                    auVar222 = ZEXT3264(auVar139);
                    auVar228 = ZEXT3264(auVar204);
                    auVar118 = vpcmpeqd_avx2(auVar149._0_32_,auVar149._0_32_);
                  }
                  auVar84._8_8_ = uStack_5d8;
                  auVar84._0_8_ = local_5e0;
                  auVar84._16_8_ = uStack_5d0;
                  auVar84._24_8_ = uStack_5c8;
                  auVar166 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar84);
                  auVar142 = auVar118 & ~auVar166;
                  if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar142 >> 0x7f,0) == '\0') &&
                        (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar142 >> 0xbf,0) == '\0') &&
                      (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar142[0x1f]) {
                    auVar166 = auVar166 ^ auVar118;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(fStack_59c,local_5a0) + 0x3e) & 0x40) != 0)))) {
                      auVar169 = ZEXT1632(auVar169._0_16_);
                      auVar180 = ZEXT1664(auVar180._0_16_);
                      (*p_Var10)(&local_7b0);
                      auVar239 = ZEXT3264(_local_740);
                      auVar148 = ZEXT3264(local_6c0);
                      auVar212 = ZEXT3264(local_760);
                      auVar222 = ZEXT3264(auVar139);
                      auVar228 = ZEXT3264(auVar204);
                    }
                    auVar85._8_8_ = uStack_5d8;
                    auVar85._0_8_ = local_5e0;
                    auVar85._16_8_ = uStack_5d0;
                    auVar85._24_8_ = uStack_5c8;
                    auVar142 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar85);
                    auVar236 = vpcmpeqd_avx2(auVar169,auVar169);
                    auVar166 = auVar142 ^ auVar236;
                    auVar118 = auVar236 & ~auVar142;
                    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar118 >> 0x7f,0) != '\0') ||
                          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar118 >> 0xbf,0) != '\0') ||
                        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar118[0x1f] < '\0') {
                      auVar146._0_4_ = auVar142._0_4_ ^ auVar236._0_4_;
                      auVar146._4_4_ = auVar142._4_4_ ^ auVar236._4_4_;
                      auVar146._8_4_ = auVar142._8_4_ ^ auVar236._8_4_;
                      auVar146._12_4_ = auVar142._12_4_ ^ auVar236._12_4_;
                      auVar146._16_4_ = auVar142._16_4_ ^ auVar236._16_4_;
                      auVar146._20_4_ = auVar142._20_4_ ^ auVar236._20_4_;
                      auVar146._24_4_ = auVar142._24_4_ ^ auVar236._24_4_;
                      auVar146._28_4_ = auVar142._28_4_ ^ auVar236._28_4_;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])local_7b0.hit);
                      *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x20));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x40));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x60));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar118;
                      auVar118 = vmaskmovps_avx(auVar146,*(undefined1 (*) [32])
                                                          (local_7b0.hit + 0x80));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar118;
                      auVar118 = vpmaskmovd_avx2(auVar146,*(undefined1 (*) [32])
                                                           (local_7b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar118;
                    }
                  }
                  auVar175 = auVar148._0_32_;
                  if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0x7f,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar166 >> 0xbf,0) == '\0') &&
                      (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar166[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar229;
                  }
                  *(undefined4 *)(local_600 + uVar93 * 4) = 0;
                  uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar121._4_4_ = uVar229;
                  auVar121._0_4_ = uVar229;
                  auVar121._8_4_ = uVar229;
                  auVar121._12_4_ = uVar229;
                  auVar121._16_4_ = uVar229;
                  auVar121._20_4_ = uVar229;
                  auVar121._24_4_ = uVar229;
                  auVar121._28_4_ = uVar229;
                  auVar142 = vcmpps_avx(auVar222._0_32_,auVar121,2);
                  auVar118 = vandps_avx(auVar142,local_600);
                  local_600 = local_600 & auVar142;
                  bVar77 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar78 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar76 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar75 = SUB321(local_600 >> 0x7f,0) != '\0';
                  bVar74 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar73 = SUB321(local_600 >> 0xbf,0) != '\0';
                  bVar71 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar70 = local_600[0x1f] < '\0';
                  if (((((((bVar77 || bVar78) || bVar76) || bVar75) || bVar74) || bVar73) || bVar71)
                      || bVar70) {
                    auVar147._8_4_ = 0x7f800000;
                    auVar147._0_8_ = 0x7f8000007f800000;
                    auVar147._12_4_ = 0x7f800000;
                    auVar147._16_4_ = 0x7f800000;
                    auVar147._20_4_ = 0x7f800000;
                    auVar147._24_4_ = 0x7f800000;
                    auVar147._28_4_ = 0x7f800000;
                    auVar142 = vblendvps_avx(auVar147,auVar222._0_32_,auVar118);
                    auVar166 = vshufps_avx(auVar142,auVar142,0xb1);
                    auVar166 = vminps_avx(auVar142,auVar166);
                    auVar236 = vshufpd_avx(auVar166,auVar166,5);
                    auVar166 = vminps_avx(auVar166,auVar236);
                    auVar236 = vpermpd_avx2(auVar166,0x4e);
                    auVar180 = ZEXT3264(auVar236);
                    auVar166 = vminps_avx(auVar166,auVar236);
                    auVar166 = vcmpps_avx(auVar142,auVar166,0);
                    auVar236 = auVar118 & auVar166;
                    auVar142 = auVar118;
                    if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar236 >> 0x7f,0) != '\0') ||
                          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar236 >> 0xbf,0) != '\0') ||
                        (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar236[0x1f] < '\0') {
                      auVar142 = vandps_avx(auVar166,auVar118);
                    }
                    uVar92 = vmovmskps_avx(auVar142);
                    uVar96 = 0;
                    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                      uVar96 = uVar96 + 1;
                    }
                    uVar93 = (ulong)uVar96;
                  }
                  local_600 = auVar118;
                } while (((((((bVar77 || bVar78) || bVar76) || bVar75) || bVar74) || bVar73) ||
                         bVar71) || bVar70);
              }
            }
            auVar148 = ZEXT3264(local_660);
            fVar171 = (float)local_780;
            fVar181 = local_780._4_4_;
            fVar151 = (float)uStack_778;
            fVar123 = uStack_778._4_4_;
            fVar125 = (float)uStack_770;
            fVar245 = uStack_770._4_4_;
            fVar246 = (float)uStack_768;
            goto LAB_01677832;
          }
        }
        auVar212 = ZEXT3264(local_760);
        auVar148 = ZEXT3264(local_660);
      }
LAB_01677832:
      if (8 < iVar91) {
        _local_740 = auVar239._0_32_;
        local_320._4_4_ = iVar91;
        local_320._0_4_ = iVar91;
        local_320._8_4_ = iVar91;
        local_320._12_4_ = iVar91;
        local_320._16_4_ = iVar91;
        local_320._20_4_ = iVar91;
        local_320._24_4_ = iVar91;
        local_320._28_4_ = iVar91;
        local_140 = local_620._0_4_;
        uStack_13c = local_620._0_4_;
        uStack_138 = local_620._0_4_;
        uStack_134 = local_620._0_4_;
        uStack_130 = local_620._0_4_;
        uStack_12c = local_620._0_4_;
        uStack_128 = local_620._0_4_;
        uStack_124 = local_620._0_4_;
        fStack_4f0 = 1.0 / local_500;
        auStack_4fc._0_4_ = fStack_4f0;
        local_500 = fStack_4f0;
        auStack_4fc._4_4_ = fStack_4f0;
        fStack_4f4 = fStack_4f0;
        local_160 = uVar94;
        uStack_15c = uVar94;
        uStack_158 = uVar94;
        uStack_154 = uVar94;
        uStack_150 = uVar94;
        uStack_14c = uVar94;
        uStack_148 = uVar94;
        uStack_144 = uVar94;
        local_180 = uVar4;
        uStack_17c = uVar4;
        uStack_178 = uVar4;
        uStack_174 = uVar4;
        uStack_170 = uVar4;
        uStack_16c = uVar4;
        uStack_168 = uVar4;
        uStack_164 = uVar4;
        lVar97 = 8;
        auVar118 = auVar228._0_32_;
        auVar110 = auVar222._0_32_;
        fVar101 = local_720;
        fVar122 = fStack_71c;
        fVar124 = fStack_718;
        fVar126 = fStack_714;
        fVar127 = fStack_710;
        fVar128 = fStack_70c;
        fVar129 = fStack_708;
        fVar170 = fStack_704;
        local_6c0 = auVar175;
        local_5a0 = fVar152;
        fStack_59c = fVar152;
        fStack_598 = fVar152;
        fStack_594 = fVar152;
        fStack_590 = fVar152;
        fStack_58c = fVar152;
        fStack_588 = fVar152;
        fStack_584 = fVar152;
        fStack_4ec = fStack_4f0;
        fStack_4e8 = fStack_4f0;
        fStack_4e4 = fStack_4f0;
        do {
          auVar153 = local_6e0;
          auVar105 = local_6f0;
          auVar142 = *(undefined1 (*) [32])(bspline_basis0 + lVar97 * 4 + lVar18);
          auVar139 = *(undefined1 (*) [32])(lVar18 + 0x222bfac + lVar97 * 4);
          _local_620 = *(undefined1 (*) [32])(lVar18 + 0x222c430 + lVar97 * 4);
          pauVar2 = (undefined1 (*) [28])(lVar18 + 0x222c8b4 + lVar97 * 4);
          auVar88 = *pauVar2;
          auVar240._0_4_ = fVar101 * *(float *)*pauVar2;
          auVar240._4_4_ = fVar122 * *(float *)(*pauVar2 + 4);
          auVar240._8_4_ = fVar124 * *(float *)(*pauVar2 + 8);
          auVar240._12_4_ = fVar126 * *(float *)(*pauVar2 + 0xc);
          auVar240._16_4_ = fVar127 * *(float *)(*pauVar2 + 0x10);
          auVar240._20_4_ = fVar128 * *(float *)(*pauVar2 + 0x14);
          auVar240._28_36_ = auVar239._28_36_;
          auVar240._24_4_ = fVar129 * *(float *)(*pauVar2 + 0x18);
          auVar239._0_4_ = fVar171 * *(float *)*pauVar2;
          auVar239._4_4_ = fVar181 * *(float *)(*pauVar2 + 4);
          auVar239._8_4_ = fVar151 * *(float *)(*pauVar2 + 8);
          auVar239._12_4_ = fVar123 * *(float *)(*pauVar2 + 0xc);
          auVar239._16_4_ = fVar125 * *(float *)(*pauVar2 + 0x10);
          auVar239._20_4_ = fVar245 * *(float *)(*pauVar2 + 0x14);
          auVar239._28_36_ = auVar180._28_36_;
          auVar239._24_4_ = fVar246 * *(float *)(*pauVar2 + 0x18);
          auVar187 = vfmadd231ps_fma(auVar240._0_32_,_local_620,local_640);
          auVar192 = vfmadd231ps_fma(auVar239._0_32_,_local_620,auVar207);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar139,auVar212._0_32_);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar139,auVar148._0_32_);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar142,auVar243);
          auVar192 = vfmadd231ps_fma(ZEXT1632(auVar192),auVar142,local_4e0);
          auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar97 * 4 + lVar18);
          auVar204 = *(undefined1 (*) [32])(lVar18 + 0x222e3cc + lVar97 * 4);
          auVar166 = *(undefined1 (*) [32])(lVar18 + 0x222e850 + lVar97 * 4);
          pfVar3 = (float *)(lVar18 + 0x222ecd4 + lVar97 * 4);
          fVar130 = *pfVar3;
          fVar150 = pfVar3[1];
          fVar223 = pfVar3[2];
          fVar224 = pfVar3[3];
          fVar225 = pfVar3[4];
          fVar226 = pfVar3[5];
          fVar79 = pfVar3[6];
          auVar40._4_4_ = fVar122 * fVar150;
          auVar40._0_4_ = fVar101 * fVar130;
          auVar40._8_4_ = fVar124 * fVar223;
          auVar40._12_4_ = fVar126 * fVar224;
          auVar40._16_4_ = fVar127 * fVar225;
          auVar40._20_4_ = fVar128 * fVar226;
          auVar40._24_4_ = fVar129 * fVar79;
          auVar40._28_4_ = fVar170;
          auVar89._4_4_ = fVar181 * fVar150;
          auVar89._0_4_ = fVar171 * fVar130;
          auVar89._8_4_ = fVar151 * fVar223;
          auVar89._12_4_ = fVar123 * fVar224;
          auVar89._16_4_ = fVar125 * fVar225;
          auVar89._20_4_ = fVar245 * fVar226;
          auVar89._24_4_ = fVar246 * fVar79;
          auVar89._28_4_ = uVar100;
          auVar14 = vfmadd231ps_fma(auVar40,auVar166,local_640);
          auVar15 = vfmadd231ps_fma(auVar89,auVar166,auVar207);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar204,auVar212._0_32_);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar204,auVar148._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar119,auVar243);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,local_4e0);
          auVar233 = ZEXT1632(auVar14);
          local_300 = ZEXT1632(auVar187);
          auVar7 = vsubps_avx(auVar233,local_300);
          _local_580 = ZEXT1632(auVar15);
          auVar176 = ZEXT1632(auVar192);
          local_560 = vsubps_avx(_local_580,auVar176);
          auVar41._4_4_ = auVar192._4_4_ * auVar7._4_4_;
          auVar41._0_4_ = auVar192._0_4_ * auVar7._0_4_;
          auVar41._8_4_ = auVar192._8_4_ * auVar7._8_4_;
          auVar41._12_4_ = auVar192._12_4_ * auVar7._12_4_;
          auVar41._16_4_ = auVar7._16_4_ * 0.0;
          auVar41._20_4_ = auVar7._20_4_ * 0.0;
          auVar41._24_4_ = auVar7._24_4_ * 0.0;
          auVar41._28_4_ = local_4e0._28_4_;
          fVar152 = local_560._0_4_;
          auVar222._0_4_ = auVar187._0_4_ * fVar152;
          fVar151 = local_560._4_4_;
          auVar222._4_4_ = auVar187._4_4_ * fVar151;
          fVar123 = local_560._8_4_;
          auVar222._8_4_ = auVar187._8_4_ * fVar123;
          fVar125 = local_560._12_4_;
          auVar222._12_4_ = auVar187._12_4_ * fVar125;
          fVar245 = local_560._16_4_;
          auVar222._16_4_ = fVar245 * 0.0;
          fVar246 = local_560._20_4_;
          auVar222._20_4_ = fVar246 * 0.0;
          fVar101 = local_560._24_4_;
          auVar222._28_36_ = auVar148._28_36_;
          auVar222._24_4_ = fVar101 * 0.0;
          auVar239 = ZEXT3264(_local_620);
          auVar221 = vsubps_avx(auVar41,auVar222._0_32_);
          local_8e0 = auVar88._0_4_;
          fStack_8dc = auVar88._4_4_;
          fStack_8d8 = auVar88._8_4_;
          fStack_8d4 = auVar88._12_4_;
          fStack_8d0 = auVar88._16_4_;
          fStack_8cc = auVar88._20_4_;
          fStack_8c8 = auVar88._24_4_;
          auVar42._4_4_ = local_e0._4_4_ * fStack_8dc;
          auVar42._0_4_ = (float)local_e0 * local_8e0;
          auVar42._8_4_ = (float)uStack_d8 * fStack_8d8;
          auVar42._12_4_ = uStack_d8._4_4_ * fStack_8d4;
          auVar42._16_4_ = (float)uStack_d0 * fStack_8d0;
          auVar42._20_4_ = uStack_d0._4_4_ * fStack_8cc;
          auVar42._24_4_ = (float)uStack_c8 * fStack_8c8;
          auVar42._28_4_ = local_640._28_4_;
          auVar187 = vfmadd231ps_fma(auVar42,_local_620,local_c0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar139,local_a0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),local_80,auVar142);
          auVar43._4_4_ = local_e0._4_4_ * fVar150;
          auVar43._0_4_ = (float)local_e0 * fVar130;
          auVar43._8_4_ = (float)uStack_d8 * fVar223;
          auVar43._12_4_ = uStack_d8._4_4_ * fVar224;
          auVar43._16_4_ = (float)uStack_d0 * fVar225;
          auVar43._20_4_ = uStack_d0._4_4_ * fVar226;
          auVar43._24_4_ = (float)uStack_c8 * fVar79;
          auVar43._28_4_ = uStack_c8._4_4_;
          auVar15 = vfmadd231ps_fma(auVar43,auVar166,local_c0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar204,local_a0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,local_80);
          auVar44._4_4_ = fVar151 * fVar151;
          auVar44._0_4_ = fVar152 * fVar152;
          auVar44._8_4_ = fVar123 * fVar123;
          auVar44._12_4_ = fVar125 * fVar125;
          auVar44._16_4_ = fVar245 * fVar245;
          auVar44._20_4_ = fVar246 * fVar246;
          auVar44._24_4_ = fVar101 * fVar101;
          auVar44._28_4_ = local_80._28_4_;
          auVar106 = vfmadd231ps_fma(auVar44,auVar7,auVar7);
          auVar236 = vmaxps_avx(ZEXT1632(auVar187),ZEXT1632(auVar15));
          auVar218._0_4_ = auVar236._0_4_ * auVar236._0_4_ * auVar106._0_4_;
          auVar218._4_4_ = auVar236._4_4_ * auVar236._4_4_ * auVar106._4_4_;
          auVar218._8_4_ = auVar236._8_4_ * auVar236._8_4_ * auVar106._8_4_;
          auVar218._12_4_ = auVar236._12_4_ * auVar236._12_4_ * auVar106._12_4_;
          auVar218._16_4_ = auVar236._16_4_ * auVar236._16_4_ * 0.0;
          auVar218._20_4_ = auVar236._20_4_ * auVar236._20_4_ * 0.0;
          auVar218._24_4_ = auVar236._24_4_ * auVar236._24_4_ * 0.0;
          auVar218._28_4_ = 0;
          auVar45._4_4_ = auVar221._4_4_ * auVar221._4_4_;
          auVar45._0_4_ = auVar221._0_4_ * auVar221._0_4_;
          auVar45._8_4_ = auVar221._8_4_ * auVar221._8_4_;
          auVar45._12_4_ = auVar221._12_4_ * auVar221._12_4_;
          auVar45._16_4_ = auVar221._16_4_ * auVar221._16_4_;
          auVar45._20_4_ = auVar221._20_4_ * auVar221._20_4_;
          auVar45._24_4_ = auVar221._24_4_ * auVar221._24_4_;
          auVar45._28_4_ = auVar221._28_4_;
          auVar236 = vcmpps_avx(auVar45,auVar218,2);
          auVar180 = ZEXT3264(auVar236);
          local_460 = (int)lVar97;
          auVar219._4_4_ = local_460;
          auVar219._0_4_ = local_460;
          auVar219._8_4_ = local_460;
          auVar219._12_4_ = local_460;
          auVar219._16_4_ = local_460;
          auVar219._20_4_ = local_460;
          auVar219._24_4_ = local_460;
          auVar219._28_4_ = local_460;
          auVar221 = vpor_avx2(auVar219,_DAT_0205a920);
          auVar112 = vpcmpgtd_avx2(local_320,auVar221);
          auVar221 = auVar112 & auVar236;
          fVar101 = local_720;
          fVar122 = fStack_71c;
          fVar124 = fStack_718;
          fVar126 = fStack_714;
          fVar127 = fStack_710;
          fVar128 = fStack_70c;
          fVar129 = fStack_708;
          fVar170 = fStack_704;
          fVar171 = (float)local_780;
          fVar181 = local_780._4_4_;
          fVar151 = (float)uStack_778;
          fVar123 = uStack_778._4_4_;
          fVar125 = (float)uStack_770;
          fVar245 = uStack_770._4_4_;
          fVar246 = (float)uStack_768;
          if ((((((((auVar221 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar221 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar221 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar221 >> 0x7f,0) == '\0') &&
                (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar221 >> 0xbf,0) == '\0') &&
              (auVar221 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar221[0x1f]) {
LAB_016783e9:
            auVar148 = ZEXT3264(local_660);
            auVar212 = ZEXT3264(local_760);
          }
          else {
            local_340 = vandps_avx(auVar112,auVar236);
            auVar46._4_4_ = (float)local_740._4_4_ * fVar150;
            auVar46._0_4_ = (float)local_740._0_4_ * fVar130;
            auVar46._8_4_ = fStack_738 * fVar223;
            auVar46._12_4_ = fStack_734 * fVar224;
            auVar46._16_4_ = fStack_730 * fVar225;
            auVar46._20_4_ = fStack_72c * fVar226;
            auVar46._24_4_ = fStack_728 * fVar79;
            auVar46._28_4_ = auVar236._28_4_;
            auVar106 = vfmadd213ps_fma(auVar166,local_540,auVar46);
            auVar106 = vfmadd213ps_fma(auVar204,local_100,ZEXT1632(auVar106));
            auVar106 = vfmadd132ps_fma(auVar119,ZEXT1632(auVar106),local_6c0);
            auVar47._4_4_ = (float)local_740._4_4_ * fStack_8dc;
            auVar47._0_4_ = (float)local_740._0_4_ * local_8e0;
            auVar47._8_4_ = fStack_738 * fStack_8d8;
            auVar47._12_4_ = fStack_734 * fStack_8d4;
            auVar47._16_4_ = fStack_730 * fStack_8d0;
            auVar47._20_4_ = fStack_72c * fStack_8cc;
            auVar47._24_4_ = fStack_728 * fStack_8c8;
            auVar47._28_4_ = auVar236._28_4_;
            auVar132 = vfmadd213ps_fma(_local_620,local_540,auVar47);
            auVar132 = vfmadd213ps_fma(auVar139,local_100,ZEXT1632(auVar132));
            auVar139 = *(undefined1 (*) [32])(lVar18 + 0x222cd38 + lVar97 * 4);
            auVar204 = *(undefined1 (*) [32])(lVar18 + 0x222d1bc + lVar97 * 4);
            auVar166 = *(undefined1 (*) [32])(lVar18 + 0x222d640 + lVar97 * 4);
            pfVar3 = (float *)(lVar18 + 0x222dac4 + lVar97 * 4);
            fVar152 = *pfVar3;
            fVar130 = pfVar3[1];
            fVar150 = pfVar3[2];
            fVar223 = pfVar3[3];
            fVar224 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar226 = pfVar3[6];
            auVar215._0_4_ = local_720 * fVar152;
            auVar215._4_4_ = fStack_71c * fVar130;
            auVar215._8_4_ = fStack_718 * fVar150;
            auVar215._12_4_ = fStack_714 * fVar223;
            auVar215._16_4_ = fStack_710 * fVar224;
            auVar215._20_4_ = fStack_70c * fVar225;
            auVar215._24_4_ = fStack_708 * fVar226;
            auVar215._28_4_ = 0;
            auVar237._0_4_ = (float)local_780 * fVar152;
            auVar237._4_4_ = local_780._4_4_ * fVar130;
            auVar237._8_4_ = (float)uStack_778 * fVar150;
            auVar237._12_4_ = uStack_778._4_4_ * fVar223;
            auVar237._16_4_ = (float)uStack_770 * fVar224;
            auVar237._20_4_ = uStack_770._4_4_ * fVar225;
            auVar237._24_4_ = (float)uStack_768 * fVar226;
            auVar237._28_4_ = 0;
            auVar48._4_4_ = fVar130 * (float)local_740._4_4_;
            auVar48._0_4_ = fVar152 * (float)local_740._0_4_;
            auVar48._8_4_ = fVar150 * fStack_738;
            auVar48._12_4_ = fVar223 * fStack_734;
            auVar48._16_4_ = fVar224 * fStack_730;
            auVar48._20_4_ = fVar225 * fStack_72c;
            auVar48._24_4_ = fVar226 * fStack_728;
            auVar48._28_4_ = pfVar3[7];
            auVar104 = vfmadd231ps_fma(auVar215,auVar166,local_640);
            auVar133 = vfmadd231ps_fma(auVar237,auVar166,auVar207);
            auVar172 = vfmadd231ps_fma(auVar48,local_540,auVar166);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar204,local_760);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar204,local_660);
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_100,auVar204);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar139,auVar243);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar139,local_4e0);
            auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar139,local_6c0);
            pfVar3 = (float *)(lVar18 + 0x222fee4 + lVar97 * 4);
            fVar152 = *pfVar3;
            fVar130 = pfVar3[1];
            fVar150 = pfVar3[2];
            fVar223 = pfVar3[3];
            fVar224 = pfVar3[4];
            fVar225 = pfVar3[5];
            fVar226 = pfVar3[6];
            auVar49._4_4_ = fStack_71c * fVar130;
            auVar49._0_4_ = local_720 * fVar152;
            auVar49._8_4_ = fStack_718 * fVar150;
            auVar49._12_4_ = fStack_714 * fVar223;
            auVar49._16_4_ = fStack_710 * fVar224;
            auVar49._20_4_ = fStack_70c * fVar225;
            auVar49._24_4_ = fStack_708 * fVar226;
            auVar49._28_4_ = fStack_704;
            auVar50._4_4_ = local_780._4_4_ * fVar130;
            auVar50._0_4_ = (float)local_780 * fVar152;
            auVar50._8_4_ = (float)uStack_778 * fVar150;
            auVar50._12_4_ = uStack_778._4_4_ * fVar223;
            auVar50._16_4_ = (float)uStack_770 * fVar224;
            auVar50._20_4_ = uStack_770._4_4_ * fVar225;
            auVar50._24_4_ = (float)uStack_768 * fVar226;
            auVar50._28_4_ = uStack_768._4_4_;
            auVar51._4_4_ = fVar130 * (float)local_740._4_4_;
            auVar51._0_4_ = fVar152 * (float)local_740._0_4_;
            auVar51._8_4_ = fVar150 * fStack_738;
            auVar51._12_4_ = fVar223 * fStack_734;
            auVar51._16_4_ = fVar224 * fStack_730;
            auVar51._20_4_ = fVar225 * fStack_72c;
            auVar51._24_4_ = fVar226 * fStack_728;
            auVar51._28_4_ = pfVar3[7];
            auVar139 = *(undefined1 (*) [32])(lVar18 + 0x222fa60 + lVar97 * 4);
            auVar183 = vfmadd231ps_fma(auVar49,auVar139,local_640);
            auVar103 = vfmadd231ps_fma(auVar50,auVar139,auVar207);
            auVar131 = vfmadd231ps_fma(auVar51,local_540,auVar139);
            auVar139 = *(undefined1 (*) [32])(lVar18 + 0x222f5dc + lVar97 * 4);
            auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar139,local_760);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar139,local_660);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_100,auVar139);
            auVar139 = *(undefined1 (*) [32])(lVar18 + 0x222f158 + lVar97 * 4);
            auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar139,auVar243);
            auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar139,local_4e0);
            auVar131 = vfmadd231ps_fma(ZEXT1632(auVar131),local_6c0,auVar139);
            auVar220._8_4_ = 0x7fffffff;
            auVar220._0_8_ = 0x7fffffff7fffffff;
            auVar220._12_4_ = 0x7fffffff;
            auVar220._16_4_ = 0x7fffffff;
            auVar220._20_4_ = 0x7fffffff;
            auVar220._24_4_ = 0x7fffffff;
            auVar220._28_4_ = 0x7fffffff;
            auVar139 = vandps_avx(ZEXT1632(auVar104),auVar220);
            auVar204 = vandps_avx(ZEXT1632(auVar133),auVar220);
            auVar204 = vmaxps_avx(auVar139,auVar204);
            auVar139 = vandps_avx(ZEXT1632(auVar172),auVar220);
            auVar139 = vmaxps_avx(auVar204,auVar139);
            auVar86._4_4_ = fStack_59c;
            auVar86._0_4_ = local_5a0;
            auVar86._8_4_ = fStack_598;
            auVar86._12_4_ = fStack_594;
            auVar86._16_4_ = fStack_590;
            auVar86._20_4_ = fStack_58c;
            auVar86._24_4_ = fStack_588;
            auVar86._28_4_ = fStack_584;
            auVar139 = vcmpps_avx(auVar139,auVar86,1);
            auVar166 = vblendvps_avx(ZEXT1632(auVar104),auVar7,auVar139);
            auVar236 = vblendvps_avx(ZEXT1632(auVar133),local_560,auVar139);
            auVar139 = vandps_avx(ZEXT1632(auVar183),auVar220);
            auVar204 = vandps_avx(ZEXT1632(auVar103),auVar220);
            auVar204 = vmaxps_avx(auVar139,auVar204);
            auVar139 = vandps_avx(auVar220,ZEXT1632(auVar131));
            auVar139 = vmaxps_avx(auVar204,auVar139);
            auVar204 = vcmpps_avx(auVar139,auVar86,1);
            auVar139 = vblendvps_avx(ZEXT1632(auVar183),auVar7,auVar204);
            auVar204 = vblendvps_avx(ZEXT1632(auVar103),local_560,auVar204);
            auVar132 = vfmadd213ps_fma(auVar142,local_6c0,ZEXT1632(auVar132));
            auVar104 = vfmadd213ps_fma(auVar166,auVar166,ZEXT832(0) << 0x20);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar236,auVar236);
            auVar142 = vrsqrtps_avx(ZEXT1632(auVar104));
            fVar152 = auVar142._0_4_;
            fVar130 = auVar142._4_4_;
            fVar150 = auVar142._8_4_;
            fVar223 = auVar142._12_4_;
            fVar224 = auVar142._16_4_;
            fVar225 = auVar142._20_4_;
            fVar226 = auVar142._24_4_;
            auVar52._4_4_ = fVar130 * fVar130 * fVar130 * auVar104._4_4_ * -0.5;
            auVar52._0_4_ = fVar152 * fVar152 * fVar152 * auVar104._0_4_ * -0.5;
            auVar52._8_4_ = fVar150 * fVar150 * fVar150 * auVar104._8_4_ * -0.5;
            auVar52._12_4_ = fVar223 * fVar223 * fVar223 * auVar104._12_4_ * -0.5;
            auVar52._16_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar52._20_4_ = fVar225 * fVar225 * fVar225 * -0.0;
            auVar52._24_4_ = fVar226 * fVar226 * fVar226 * -0.0;
            auVar52._28_4_ = 0;
            auVar244._8_4_ = 0x3fc00000;
            auVar244._0_8_ = 0x3fc000003fc00000;
            auVar244._12_4_ = 0x3fc00000;
            auVar244._16_4_ = 0x3fc00000;
            auVar244._20_4_ = 0x3fc00000;
            auVar244._24_4_ = 0x3fc00000;
            auVar244._28_4_ = 0x3fc00000;
            auVar104 = vfmadd231ps_fma(auVar52,auVar244,auVar142);
            fVar152 = auVar104._0_4_;
            fVar130 = auVar104._4_4_;
            auVar53._4_4_ = auVar236._4_4_ * fVar130;
            auVar53._0_4_ = auVar236._0_4_ * fVar152;
            fVar150 = auVar104._8_4_;
            auVar53._8_4_ = auVar236._8_4_ * fVar150;
            fVar223 = auVar104._12_4_;
            auVar53._12_4_ = auVar236._12_4_ * fVar223;
            auVar53._16_4_ = auVar236._16_4_ * 0.0;
            auVar53._20_4_ = auVar236._20_4_ * 0.0;
            auVar53._24_4_ = auVar236._24_4_ * 0.0;
            auVar53._28_4_ = auVar142._28_4_;
            auVar54._4_4_ = fVar130 * -auVar166._4_4_;
            auVar54._0_4_ = fVar152 * -auVar166._0_4_;
            auVar54._8_4_ = fVar150 * -auVar166._8_4_;
            auVar54._12_4_ = fVar223 * -auVar166._12_4_;
            auVar54._16_4_ = -auVar166._16_4_ * 0.0;
            auVar54._20_4_ = -auVar166._20_4_ * 0.0;
            auVar54._24_4_ = -auVar166._24_4_ * 0.0;
            auVar54._28_4_ = auVar236._28_4_;
            auVar104 = vfmadd213ps_fma(auVar139,auVar139,ZEXT832(0) << 0x20);
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar204,auVar204);
            auVar142 = vrsqrtps_avx(ZEXT1632(auVar104));
            auVar55._28_4_ = local_760._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar223 * 0.0,
                                    CONCAT48(fVar150 * 0.0,CONCAT44(fVar130 * 0.0,fVar152 * 0.0))));
            fVar152 = auVar142._0_4_;
            fVar130 = auVar142._4_4_;
            fVar150 = auVar142._8_4_;
            fVar223 = auVar142._12_4_;
            fVar224 = auVar142._16_4_;
            fVar225 = auVar142._20_4_;
            fVar226 = auVar142._24_4_;
            auVar56._4_4_ = fVar130 * fVar130 * fVar130 * auVar104._4_4_ * -0.5;
            auVar56._0_4_ = fVar152 * fVar152 * fVar152 * auVar104._0_4_ * -0.5;
            auVar56._8_4_ = fVar150 * fVar150 * fVar150 * auVar104._8_4_ * -0.5;
            auVar56._12_4_ = fVar223 * fVar223 * fVar223 * auVar104._12_4_ * -0.5;
            auVar56._16_4_ = fVar224 * fVar224 * fVar224 * -0.0;
            auVar56._20_4_ = fVar225 * fVar225 * fVar225 * -0.0;
            auVar56._24_4_ = fVar226 * fVar226 * fVar226 * -0.0;
            auVar56._28_4_ = 0;
            auVar104 = vfmadd231ps_fma(auVar56,auVar244,auVar142);
            fVar152 = auVar104._0_4_;
            fVar130 = auVar104._4_4_;
            auVar57._4_4_ = auVar204._4_4_ * fVar130;
            auVar57._0_4_ = auVar204._0_4_ * fVar152;
            fVar150 = auVar104._8_4_;
            auVar57._8_4_ = auVar204._8_4_ * fVar150;
            fVar223 = auVar104._12_4_;
            auVar57._12_4_ = auVar204._12_4_ * fVar223;
            auVar57._16_4_ = auVar204._16_4_ * 0.0;
            auVar57._20_4_ = auVar204._20_4_ * 0.0;
            auVar57._24_4_ = auVar204._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar130 * -auVar139._4_4_;
            auVar58._0_4_ = fVar152 * -auVar139._0_4_;
            auVar58._8_4_ = fVar150 * -auVar139._8_4_;
            auVar58._12_4_ = fVar223 * -auVar139._12_4_;
            auVar58._16_4_ = -auVar139._16_4_ * 0.0;
            auVar58._20_4_ = -auVar139._20_4_ * 0.0;
            auVar58._24_4_ = -auVar139._24_4_ * 0.0;
            auVar58._28_4_ = auVar142._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar223 * 0.0,
                                    CONCAT48(fVar150 * 0.0,CONCAT44(fVar130 * 0.0,fVar152 * 0.0))));
            auVar104 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar187),local_300);
            auVar142 = ZEXT1632(auVar187);
            auVar133 = vfmadd213ps_fma(auVar54,auVar142,auVar176);
            auVar172 = vfmadd213ps_fma(auVar55,auVar142,ZEXT1632(auVar132));
            auVar131 = vfnmadd213ps_fma(auVar53,auVar142,local_300);
            auVar183 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar15),auVar233);
            auVar182 = vfnmadd213ps_fma(auVar54,auVar142,auVar176);
            auVar142 = ZEXT1632(auVar15);
            auVar103 = vfmadd213ps_fma(auVar58,auVar142,_local_580);
            auVar113 = ZEXT1632(auVar187);
            auVar187 = vfnmadd231ps_fma(ZEXT1632(auVar132),auVar113,auVar55);
            auVar132 = vfmadd213ps_fma(auVar59,auVar142,ZEXT1632(auVar106));
            auVar197 = vfnmadd213ps_fma(auVar57,auVar142,auVar233);
            auVar198 = vfnmadd213ps_fma(auVar58,auVar142,_local_580);
            auVar199 = vfnmadd231ps_fma(ZEXT1632(auVar106),ZEXT1632(auVar15),auVar59);
            auVar142 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar182));
            auVar139 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar187));
            auVar60._4_4_ = auVar142._4_4_ * auVar187._4_4_;
            auVar60._0_4_ = auVar142._0_4_ * auVar187._0_4_;
            auVar60._8_4_ = auVar142._8_4_ * auVar187._8_4_;
            auVar60._12_4_ = auVar142._12_4_ * auVar187._12_4_;
            auVar60._16_4_ = auVar142._16_4_ * 0.0;
            auVar60._20_4_ = auVar142._20_4_ * 0.0;
            auVar60._24_4_ = auVar142._24_4_ * 0.0;
            auVar60._28_4_ = local_760._28_4_;
            auVar106 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar182),auVar139);
            auVar61._4_4_ = auVar131._4_4_ * auVar139._4_4_;
            auVar61._0_4_ = auVar131._0_4_ * auVar139._0_4_;
            auVar61._8_4_ = auVar131._8_4_ * auVar139._8_4_;
            auVar61._12_4_ = auVar131._12_4_ * auVar139._12_4_;
            auVar61._16_4_ = auVar139._16_4_ * 0.0;
            auVar61._20_4_ = auVar139._20_4_ * 0.0;
            auVar61._24_4_ = auVar139._24_4_ * 0.0;
            auVar61._28_4_ = auVar139._28_4_;
            auVar221 = ZEXT1632(auVar131);
            auVar139 = vsubps_avx(ZEXT1632(auVar183),auVar221);
            auVar119 = ZEXT1632(auVar187);
            auVar187 = vfmsub231ps_fma(auVar61,auVar119,auVar139);
            auVar62._4_4_ = auVar182._4_4_ * auVar139._4_4_;
            auVar62._0_4_ = auVar182._0_4_ * auVar139._0_4_;
            auVar62._8_4_ = auVar182._8_4_ * auVar139._8_4_;
            auVar62._12_4_ = auVar182._12_4_ * auVar139._12_4_;
            auVar62._16_4_ = auVar139._16_4_ * 0.0;
            auVar62._20_4_ = auVar139._20_4_ * 0.0;
            auVar62._24_4_ = auVar139._24_4_ * 0.0;
            auVar62._28_4_ = auVar139._28_4_;
            auVar131 = vfmsub231ps_fma(auVar62,auVar221,auVar142);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar131),ZEXT832(0) << 0x20,ZEXT1632(auVar187));
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar176 = vcmpps_avx(ZEXT1632(auVar187),ZEXT832(0) << 0x20,2);
            auVar142 = vblendvps_avx(ZEXT1632(auVar197),ZEXT1632(auVar104),auVar176);
            auVar139 = vblendvps_avx(ZEXT1632(auVar198),ZEXT1632(auVar133),auVar176);
            auVar204 = vblendvps_avx(ZEXT1632(auVar199),ZEXT1632(auVar172),auVar176);
            auVar166 = vblendvps_avx(auVar221,ZEXT1632(auVar183),auVar176);
            auVar236 = vblendvps_avx(ZEXT1632(auVar182),ZEXT1632(auVar103),auVar176);
            auVar7 = vblendvps_avx(auVar119,ZEXT1632(auVar132),auVar176);
            auVar221 = vblendvps_avx(ZEXT1632(auVar183),auVar221,auVar176);
            auVar112 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar182),auVar176);
            auVar187 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
            auVar119 = vblendvps_avx(ZEXT1632(auVar132),auVar119,auVar176);
            auVar221 = vsubps_avx(auVar221,auVar142);
            auVar112 = vsubps_avx(auVar112,auVar139);
            auVar233 = vsubps_avx(auVar119,auVar204);
            auVar239 = ZEXT3264(auVar233);
            auVar16 = vsubps_avx(auVar142,auVar166);
            auVar17 = vsubps_avx(auVar139,auVar236);
            auVar111 = vsubps_avx(auVar204,auVar7);
            auVar201._0_4_ = auVar233._0_4_ * auVar142._0_4_;
            auVar201._4_4_ = auVar233._4_4_ * auVar142._4_4_;
            auVar201._8_4_ = auVar233._8_4_ * auVar142._8_4_;
            auVar201._12_4_ = auVar233._12_4_ * auVar142._12_4_;
            auVar201._16_4_ = auVar233._16_4_ * auVar142._16_4_;
            auVar201._20_4_ = auVar233._20_4_ * auVar142._20_4_;
            auVar201._24_4_ = auVar233._24_4_ * auVar142._24_4_;
            auVar201._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar201,auVar204,auVar221);
            auVar63._4_4_ = auVar221._4_4_ * auVar139._4_4_;
            auVar63._0_4_ = auVar221._0_4_ * auVar139._0_4_;
            auVar63._8_4_ = auVar221._8_4_ * auVar139._8_4_;
            auVar63._12_4_ = auVar221._12_4_ * auVar139._12_4_;
            auVar63._16_4_ = auVar221._16_4_ * auVar139._16_4_;
            auVar63._20_4_ = auVar221._20_4_ * auVar139._20_4_;
            auVar63._24_4_ = auVar221._24_4_ * auVar139._24_4_;
            auVar63._28_4_ = auVar119._28_4_;
            auVar132 = vfmsub231ps_fma(auVar63,auVar142,auVar112);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar132),ZEXT1632(auVar106),_DAT_02020f00);
            auVar202._0_4_ = auVar112._0_4_ * auVar204._0_4_;
            auVar202._4_4_ = auVar112._4_4_ * auVar204._4_4_;
            auVar202._8_4_ = auVar112._8_4_ * auVar204._8_4_;
            auVar202._12_4_ = auVar112._12_4_ * auVar204._12_4_;
            auVar202._16_4_ = auVar112._16_4_ * auVar204._16_4_;
            auVar202._20_4_ = auVar112._20_4_ * auVar204._20_4_;
            auVar202._24_4_ = auVar112._24_4_ * auVar204._24_4_;
            auVar202._28_4_ = 0;
            auVar132 = vfmsub231ps_fma(auVar202,auVar139,auVar233);
            auVar132 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar132));
            auVar203._0_4_ = auVar111._0_4_ * auVar166._0_4_;
            auVar203._4_4_ = auVar111._4_4_ * auVar166._4_4_;
            auVar203._8_4_ = auVar111._8_4_ * auVar166._8_4_;
            auVar203._12_4_ = auVar111._12_4_ * auVar166._12_4_;
            auVar203._16_4_ = auVar111._16_4_ * auVar166._16_4_;
            auVar203._20_4_ = auVar111._20_4_ * auVar166._20_4_;
            auVar203._24_4_ = auVar111._24_4_ * auVar166._24_4_;
            auVar203._28_4_ = 0;
            auVar106 = vfmsub231ps_fma(auVar203,auVar16,auVar7);
            auVar64._4_4_ = auVar17._4_4_ * auVar7._4_4_;
            auVar64._0_4_ = auVar17._0_4_ * auVar7._0_4_;
            auVar64._8_4_ = auVar17._8_4_ * auVar7._8_4_;
            auVar64._12_4_ = auVar17._12_4_ * auVar7._12_4_;
            auVar64._16_4_ = auVar17._16_4_ * auVar7._16_4_;
            auVar64._20_4_ = auVar17._20_4_ * auVar7._20_4_;
            auVar64._24_4_ = auVar17._24_4_ * auVar7._24_4_;
            auVar64._28_4_ = auVar7._28_4_;
            auVar104 = vfmsub231ps_fma(auVar64,auVar236,auVar111);
            auVar65._4_4_ = auVar16._4_4_ * auVar236._4_4_;
            auVar65._0_4_ = auVar16._0_4_ * auVar236._0_4_;
            auVar65._8_4_ = auVar16._8_4_ * auVar236._8_4_;
            auVar65._12_4_ = auVar16._12_4_ * auVar236._12_4_;
            auVar65._16_4_ = auVar16._16_4_ * auVar236._16_4_;
            auVar65._20_4_ = auVar16._20_4_ * auVar236._20_4_;
            auVar65._24_4_ = auVar16._24_4_ * auVar236._24_4_;
            auVar65._28_4_ = auVar236._28_4_;
            auVar133 = vfmsub231ps_fma(auVar65,auVar17,auVar166);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT832(0) << 0x20,ZEXT1632(auVar106));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar104));
            auVar166 = vmaxps_avx(ZEXT1632(auVar132),ZEXT1632(auVar104));
            auVar166 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,2);
            auVar106 = vpackssdw_avx(auVar166._0_16_,auVar166._16_16_);
            auVar106 = vpand_avx(auVar106,auVar187);
            auVar166 = vpmovsxwd_avx2(auVar106);
            if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar166 >> 0x7f,0) == '\0') &&
                  (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar166 >> 0xbf,0) == '\0') &&
                (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar166[0x1f]) {
LAB_01678760:
              auVar180 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
            }
            else {
              auVar66._4_4_ = auVar112._4_4_ * auVar111._4_4_;
              auVar66._0_4_ = auVar112._0_4_ * auVar111._0_4_;
              auVar66._8_4_ = auVar112._8_4_ * auVar111._8_4_;
              auVar66._12_4_ = auVar112._12_4_ * auVar111._12_4_;
              auVar66._16_4_ = auVar112._16_4_ * auVar111._16_4_;
              auVar66._20_4_ = auVar112._20_4_ * auVar111._20_4_;
              auVar66._24_4_ = auVar112._24_4_ * auVar111._24_4_;
              auVar66._28_4_ = auVar166._28_4_;
              auVar103 = vfmsub231ps_fma(auVar66,auVar17,auVar233);
              auVar208._0_4_ = auVar233._0_4_ * auVar16._0_4_;
              auVar208._4_4_ = auVar233._4_4_ * auVar16._4_4_;
              auVar208._8_4_ = auVar233._8_4_ * auVar16._8_4_;
              auVar208._12_4_ = auVar233._12_4_ * auVar16._12_4_;
              auVar208._16_4_ = auVar233._16_4_ * auVar16._16_4_;
              auVar208._20_4_ = auVar233._20_4_ * auVar16._20_4_;
              auVar208._24_4_ = auVar233._24_4_ * auVar16._24_4_;
              auVar208._28_4_ = 0;
              auVar183 = vfmsub231ps_fma(auVar208,auVar221,auVar111);
              auVar67._4_4_ = auVar221._4_4_ * auVar17._4_4_;
              auVar67._0_4_ = auVar221._0_4_ * auVar17._0_4_;
              auVar67._8_4_ = auVar221._8_4_ * auVar17._8_4_;
              auVar67._12_4_ = auVar221._12_4_ * auVar17._12_4_;
              auVar67._16_4_ = auVar221._16_4_ * auVar17._16_4_;
              auVar67._20_4_ = auVar221._20_4_ * auVar17._20_4_;
              auVar67._24_4_ = auVar221._24_4_ * auVar17._24_4_;
              auVar67._28_4_ = auVar17._28_4_;
              auVar131 = vfmsub231ps_fma(auVar67,auVar16,auVar112);
              auVar133 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar183),ZEXT1632(auVar131));
              auVar172 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar103),ZEXT832(0) << 0x20);
              auVar166 = vrcpps_avx(ZEXT1632(auVar172));
              auVar238._8_4_ = 0x3f800000;
              auVar238._0_8_ = &DAT_3f8000003f800000;
              auVar238._12_4_ = 0x3f800000;
              auVar238._16_4_ = 0x3f800000;
              auVar238._20_4_ = 0x3f800000;
              auVar238._24_4_ = 0x3f800000;
              auVar238._28_4_ = 0x3f800000;
              auVar239 = ZEXT3264(auVar238);
              auVar133 = vfnmadd213ps_fma(auVar166,ZEXT1632(auVar172),auVar238);
              auVar133 = vfmadd132ps_fma(ZEXT1632(auVar133),auVar166,auVar166);
              auVar177._0_4_ = auVar131._0_4_ * auVar204._0_4_;
              auVar177._4_4_ = auVar131._4_4_ * auVar204._4_4_;
              auVar177._8_4_ = auVar131._8_4_ * auVar204._8_4_;
              auVar177._12_4_ = auVar131._12_4_ * auVar204._12_4_;
              auVar177._16_4_ = auVar204._16_4_ * 0.0;
              auVar177._20_4_ = auVar204._20_4_ * 0.0;
              auVar177._24_4_ = auVar204._24_4_ * 0.0;
              auVar177._28_4_ = 0;
              auVar183 = vfmadd231ps_fma(auVar177,ZEXT1632(auVar183),auVar139);
              auVar183 = vfmadd231ps_fma(ZEXT1632(auVar183),auVar142,ZEXT1632(auVar103));
              fVar152 = auVar133._0_4_;
              fVar130 = auVar133._4_4_;
              fVar150 = auVar133._8_4_;
              fVar223 = auVar133._12_4_;
              auVar204 = ZEXT1632(CONCAT412(fVar223 * auVar183._12_4_,
                                            CONCAT48(fVar150 * auVar183._8_4_,
                                                     CONCAT44(fVar130 * auVar183._4_4_,
                                                              fVar152 * auVar183._0_4_))));
              uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar178._4_4_ = uVar229;
              auVar178._0_4_ = uVar229;
              auVar178._8_4_ = uVar229;
              auVar178._12_4_ = uVar229;
              auVar178._16_4_ = uVar229;
              auVar178._20_4_ = uVar229;
              auVar178._24_4_ = uVar229;
              auVar178._28_4_ = uVar229;
              auVar87._4_4_ = uStack_13c;
              auVar87._0_4_ = local_140;
              auVar87._8_4_ = uStack_138;
              auVar87._12_4_ = uStack_134;
              auVar87._16_4_ = uStack_130;
              auVar87._20_4_ = uStack_12c;
              auVar87._24_4_ = uStack_128;
              auVar87._28_4_ = uStack_124;
              auVar142 = vcmpps_avx(auVar87,auVar204,2);
              auVar139 = vcmpps_avx(auVar204,auVar178,2);
              auVar142 = vandps_avx(auVar139,auVar142);
              auVar133 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
              auVar106 = vpand_avx(auVar106,auVar133);
              auVar142 = vpmovsxwd_avx2(auVar106);
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar142 >> 0x7f,0) == '\0') &&
                    (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0xbf,0) == '\0') &&
                  (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar142[0x1f]) goto LAB_01678760;
              auVar142 = vcmpps_avx(ZEXT1632(auVar172),ZEXT832(0) << 0x20,4);
              auVar133 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
              auVar106 = vpand_avx(auVar106,auVar133);
              auVar142 = vpmovsxwd_avx2(auVar106);
              auVar180 = ZEXT3264(CONCAT824(uStack_5a8,
                                            CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
              if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar142 >> 0x7f,0) != '\0') ||
                    (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar142 >> 0xbf,0) != '\0') ||
                  (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar142[0x1f] < '\0') {
                auVar166 = ZEXT1632(CONCAT412(fVar223 * auVar132._12_4_,
                                              CONCAT48(fVar150 * auVar132._8_4_,
                                                       CONCAT44(fVar130 * auVar132._4_4_,
                                                                fVar152 * auVar132._0_4_))));
                auVar68._28_4_ = SUB84(uStack_5a8,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar223 * auVar104._12_4_,
                                        CONCAT48(fVar150 * auVar104._8_4_,
                                                 CONCAT44(fVar130 * auVar104._4_4_,
                                                          fVar152 * auVar104._0_4_))));
                auVar234._8_4_ = 0x3f800000;
                auVar234._0_8_ = &DAT_3f8000003f800000;
                auVar234._12_4_ = 0x3f800000;
                auVar234._16_4_ = 0x3f800000;
                auVar234._20_4_ = 0x3f800000;
                auVar234._24_4_ = 0x3f800000;
                auVar234._28_4_ = 0x3f800000;
                auVar139 = vsubps_avx(auVar234,auVar166);
                local_120 = vblendvps_avx(auVar139,auVar166,auVar176);
                auVar139 = vsubps_avx(auVar234,auVar68);
                local_380 = vblendvps_avx(auVar139,auVar68,auVar176);
                auVar180 = ZEXT3264(auVar142);
                local_520 = auVar204;
              }
            }
            auVar228 = ZEXT3264(auVar118);
            auVar142 = auVar180._0_32_;
            if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar142 >> 0x7f,0) == '\0') &&
                  (auVar180 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                 SUB321(auVar142 >> 0xbf,0) == '\0') &&
                (auVar180 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                -1 < auVar180[0x1f]) goto LAB_016783e9;
            auVar139 = vsubps_avx(ZEXT1632(auVar15),auVar113);
            auVar15 = vfmadd213ps_fma(auVar139,local_120,auVar113);
            fVar152 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar69._4_4_ = (auVar15._4_4_ + auVar15._4_4_) * fVar152;
            auVar69._0_4_ = (auVar15._0_4_ + auVar15._0_4_) * fVar152;
            auVar69._8_4_ = (auVar15._8_4_ + auVar15._8_4_) * fVar152;
            auVar69._12_4_ = (auVar15._12_4_ + auVar15._12_4_) * fVar152;
            auVar69._16_4_ = fVar152 * 0.0;
            auVar69._20_4_ = fVar152 * 0.0;
            auVar69._24_4_ = fVar152 * 0.0;
            auVar69._28_4_ = fVar152;
            auVar139 = vcmpps_avx(local_520,auVar69,6);
            auVar204 = auVar142 & auVar139;
            auVar212 = ZEXT3264(local_760);
            if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar204 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar204 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar204 >> 0x7f,0) == '\0') &&
                  (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar204 >> 0xbf,0) == '\0') &&
                (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar204[0x1f]) {
              auVar148 = ZEXT3264(local_660);
            }
            else {
              local_400 = vandps_avx(auVar139,auVar142);
              auVar143._8_4_ = 0xbf800000;
              auVar143._0_8_ = 0xbf800000bf800000;
              auVar143._12_4_ = 0xbf800000;
              auVar143._16_4_ = 0xbf800000;
              auVar143._20_4_ = 0xbf800000;
              auVar143._24_4_ = 0xbf800000;
              auVar143._28_4_ = 0xbf800000;
              auVar167._8_4_ = 0x40000000;
              auVar167._0_8_ = 0x4000000040000000;
              auVar167._12_4_ = 0x40000000;
              auVar167._16_4_ = 0x40000000;
              auVar167._20_4_ = 0x40000000;
              auVar167._24_4_ = 0x40000000;
              auVar167._28_4_ = 0x40000000;
              auVar15 = vfmadd213ps_fma(local_380,auVar167,auVar143);
              auVar180 = ZEXT1664(auVar15);
              local_4c0 = local_120;
              local_4a0 = ZEXT1632(auVar15);
              local_380 = local_4a0;
              auVar142 = local_380;
              local_480 = local_520;
              local_440 = local_6e0._0_8_;
              uStack_438 = local_6e0._8_8_;
              local_430 = local_6f0._0_8_;
              uStack_428 = local_6f0._8_8_;
              local_420 = local_700;
              uStack_418 = uStack_6f8;
              pGVar98 = (context->scene->geometries).items[uVar94].ptr;
              local_380 = auVar142;
              if ((pGVar98->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                auVar239 = ZEXT1264(ZEXT812(0));
                fVar152 = (float)local_460;
                local_3e0[0] = (fVar152 + local_120._0_4_ + 0.0) * local_500;
                local_3e0[1] = (fVar152 + local_120._4_4_ + 1.0) * (float)auStack_4fc._0_4_;
                local_3e0[2] = (fVar152 + local_120._8_4_ + 2.0) * (float)auStack_4fc._4_4_;
                local_3e0[3] = (fVar152 + local_120._12_4_ + 3.0) * fStack_4f4;
                fStack_3d0 = (fVar152 + local_120._16_4_ + 4.0) * fStack_4f0;
                fStack_3cc = (fVar152 + local_120._20_4_ + 5.0) * fStack_4ec;
                fStack_3c8 = (fVar152 + local_120._24_4_ + 6.0) * fStack_4e8;
                fStack_3c4 = fVar152 + local_120._28_4_ + 7.0;
                local_380._0_8_ = auVar15._0_8_;
                local_380._8_8_ = auVar15._8_8_;
                local_3c0 = local_380._0_8_;
                uStack_3b8 = local_380._8_8_;
                uStack_3b0 = 0;
                uStack_3a8 = 0;
                local_3a0 = local_520;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar142 = vblendvps_avx(auVar144,local_520,local_400);
                auVar139 = vshufps_avx(auVar142,auVar142,0xb1);
                auVar139 = vminps_avx(auVar142,auVar139);
                auVar204 = vshufpd_avx(auVar139,auVar139,5);
                auVar139 = vminps_avx(auVar139,auVar204);
                auVar204 = vpermpd_avx2(auVar139,0x4e);
                auVar139 = vminps_avx(auVar139,auVar204);
                auVar139 = vcmpps_avx(auVar142,auVar139,0);
                auVar204 = local_400 & auVar139;
                auVar142 = local_400;
                if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar204 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar204 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar204 >> 0x7f,0) != '\0') ||
                      (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar204 >> 0xbf,0) != '\0') ||
                    (auVar204 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar204[0x1f] < '\0') {
                  auVar142 = vandps_avx(auVar139,local_400);
                }
                uVar92 = vmovmskps_avx(auVar142);
                uVar96 = 0;
                for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                  uVar96 = uVar96 + 1;
                }
                uVar93 = (ulong)uVar96;
                local_8a0 = ZEXT1632(CONCAT88(auVar187._8_8_,uVar93));
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar98->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar152 = local_3e0[uVar93];
                  uVar229 = *(undefined4 *)((long)&local_3c0 + uVar93 * 4);
                  fVar130 = 1.0 - fVar152;
                  auVar187 = ZEXT416((uint)(fVar152 * fVar130 * 4.0));
                  auVar192 = vfnmsub213ss_fma(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),auVar187
                                             );
                  auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130),auVar187)
                  ;
                  fVar130 = fVar130 * -fVar130 * 0.5;
                  fVar150 = auVar192._0_4_ * 0.5;
                  fVar223 = auVar187._0_4_ * 0.5;
                  fVar224 = fVar152 * fVar152 * 0.5;
                  auVar188._0_4_ = fVar224 * (float)local_700._0_4_;
                  auVar188._4_4_ = fVar224 * (float)local_700._4_4_;
                  auVar188._8_4_ = fVar224 * (float)uStack_6f8;
                  auVar188._12_4_ = fVar224 * uStack_6f8._4_4_;
                  auVar156._4_4_ = fVar223;
                  auVar156._0_4_ = fVar223;
                  auVar156._8_4_ = fVar223;
                  auVar156._12_4_ = fVar223;
                  auVar187 = vfmadd132ps_fma(auVar156,auVar188,local_6f0);
                  auVar189._4_4_ = fVar150;
                  auVar189._0_4_ = fVar150;
                  auVar189._8_4_ = fVar150;
                  auVar189._12_4_ = fVar150;
                  auVar187 = vfmadd132ps_fma(auVar189,auVar187,local_6e0);
                  auVar157._4_4_ = fVar130;
                  auVar157._0_4_ = fVar130;
                  auVar157._8_4_ = fVar130;
                  auVar157._12_4_ = fVar130;
                  auVar187 = vfmadd132ps_fma(auVar157,auVar187,auVar12);
                  auVar180 = ZEXT464(*(uint *)(local_3a0 + uVar93 * 4));
                  *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar93 * 4);
                  *(int *)(ray + k * 4 + 0x180) = auVar187._0_4_;
                  uVar9 = vextractps_avx(auVar187,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                  uVar9 = vextractps_avx(auVar187,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar152;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar229;
                  *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                  *(uint *)(ray + k * 4 + 0x240) = uVar94;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  _local_620 = _local_700;
                  local_680 = ZEXT1632(CONCAT88(auVar192._8_8_,lVar97));
                  local_6a0 = ZEXT1632(CONCAT88(auVar14._8_8_,pGVar98));
                  local_600 = local_400;
                  local_45c = iVar91;
                  local_450 = uVar80;
                  uStack_448 = uVar81;
                  do {
                    auVar139 = local_8a0;
                    uVar96 = *(uint *)(ray + k * 4 + 0x100);
                    fVar152 = local_3e0[local_8a0._0_8_];
                    auVar108._4_4_ = fVar152;
                    auVar108._0_4_ = fVar152;
                    auVar108._8_4_ = fVar152;
                    auVar108._12_4_ = fVar152;
                    local_240._16_4_ = fVar152;
                    local_240._0_16_ = auVar108;
                    local_240._20_4_ = fVar152;
                    local_240._24_4_ = fVar152;
                    local_240._28_4_ = fVar152;
                    uVar229 = *(undefined4 *)((long)&local_3c0 + local_8a0._0_8_ * 4);
                    local_220._4_4_ = uVar229;
                    local_220._0_4_ = uVar229;
                    local_220._8_4_ = uVar229;
                    local_220._12_4_ = uVar229;
                    local_220._16_4_ = uVar229;
                    local_220._20_4_ = uVar229;
                    local_220._24_4_ = uVar229;
                    local_220._28_4_ = uVar229;
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_3a0 + local_8a0._0_8_ * 4);
                    fVar150 = 1.0 - fVar152;
                    auVar187 = ZEXT416((uint)(fVar152 * fVar150 * 4.0));
                    auVar192 = vfnmsub213ss_fma(auVar108,auVar108,auVar187);
                    auVar187 = vfmadd213ss_fma(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),
                                               auVar187);
                    fVar130 = auVar187._0_4_ * 0.5;
                    fVar152 = fVar152 * fVar152 * 0.5;
                    auVar190._0_4_ = fVar152 * (float)local_620._0_4_;
                    auVar190._4_4_ = fVar152 * (float)local_620._4_4_;
                    auVar190._8_4_ = fVar152 * fStack_618;
                    auVar190._12_4_ = fVar152 * fStack_614;
                    auVar158._4_4_ = fVar130;
                    auVar158._0_4_ = fVar130;
                    auVar158._8_4_ = fVar130;
                    auVar158._12_4_ = fVar130;
                    auVar187 = vfmadd132ps_fma(auVar158,auVar190,auVar105);
                    fVar152 = auVar192._0_4_ * 0.5;
                    auVar191._4_4_ = fVar152;
                    auVar191._0_4_ = fVar152;
                    auVar191._8_4_ = fVar152;
                    auVar191._12_4_ = fVar152;
                    auVar187 = vfmadd132ps_fma(auVar191,auVar187,auVar153);
                    local_7b0.context = context->user;
                    fVar152 = fVar150 * -fVar150 * 0.5;
                    auVar159._4_4_ = fVar152;
                    auVar159._0_4_ = fVar152;
                    auVar159._8_4_ = fVar152;
                    auVar159._12_4_ = fVar152;
                    auVar192 = vfmadd132ps_fma(auVar159,auVar187,auVar13);
                    local_2a0 = auVar192._0_4_;
                    uStack_29c = local_2a0;
                    uStack_298 = local_2a0;
                    uStack_294 = local_2a0;
                    uStack_290 = local_2a0;
                    uStack_28c = local_2a0;
                    uStack_288 = local_2a0;
                    uStack_284 = local_2a0;
                    auVar187 = vmovshdup_avx(auVar192);
                    auVar173._0_8_ = auVar187._0_8_;
                    auVar173._8_8_ = auVar173._0_8_;
                    auVar179._16_8_ = auVar173._0_8_;
                    auVar179._0_16_ = auVar173;
                    auVar179._24_8_ = auVar173._0_8_;
                    local_280 = auVar179;
                    auVar187 = vshufps_avx(auVar192,auVar192,0xaa);
                    auVar160._0_8_ = auVar187._0_8_;
                    auVar160._8_8_ = auVar160._0_8_;
                    auVar168._16_8_ = auVar160._0_8_;
                    auVar168._0_16_ = auVar160;
                    auVar168._24_8_ = auVar160._0_8_;
                    local_260 = auVar168;
                    local_200 = CONCAT44(uStack_17c,local_180);
                    uStack_1f8 = CONCAT44(uStack_174,uStack_178);
                    uStack_1f0 = CONCAT44(uStack_16c,uStack_170);
                    uStack_1e8 = CONCAT44(uStack_164,uStack_168);
                    local_1e0 = CONCAT44(uStack_15c,local_160);
                    uStack_1d8 = CONCAT44(uStack_154,uStack_158);
                    uStack_1d0 = CONCAT44(uStack_14c,uStack_150);
                    uStack_1c8 = CONCAT44(uStack_144,uStack_148);
                    auVar142 = vpcmpeqd_avx2(local_220,local_220);
                    local_6c8[1] = auVar142;
                    *local_6c8 = auVar142;
                    local_1c0 = (local_7b0.context)->instID[0];
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = (local_7b0.context)->instPrimID[0];
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_5e0 = local_2c0._0_8_;
                    uStack_5d8 = local_2c0._8_8_;
                    uStack_5d0 = local_2c0._16_8_;
                    uStack_5c8 = local_2c0._24_8_;
                    local_7b0.valid = (int *)&local_5e0;
                    local_7b0.geometryUserPtr = pGVar98->userPtr;
                    local_7b0.hit = (RTCHitN *)&local_2a0;
                    local_7b0.N = 8;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar98->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar168 = ZEXT1632(auVar160);
                      auVar179 = ZEXT1632(auVar173);
                      (*pGVar98->intersectionFilterN)(&local_7b0);
                      auVar228._8_56_ = extraout_var;
                      auVar228._0_8_ = extraout_XMM1_Qa;
                      auVar212 = ZEXT3264(local_760);
                      auVar142 = vpcmpeqd_avx2(auVar228._0_32_,auVar228._0_32_);
                      lVar97 = local_680._0_8_;
                      pGVar98 = (Geometry *)local_6a0._0_8_;
                      fVar101 = local_720;
                      fVar122 = fStack_71c;
                      fVar124 = fStack_718;
                      fVar126 = fStack_714;
                      fVar127 = fStack_710;
                      fVar128 = fStack_70c;
                      fVar129 = fStack_708;
                      fVar170 = fStack_704;
                      fVar171 = (float)local_780;
                      fVar181 = local_780._4_4_;
                      fVar151 = (float)uStack_778;
                      fVar123 = uStack_778._4_4_;
                      fVar125 = (float)uStack_770;
                      fVar245 = uStack_770._4_4_;
                      fVar246 = (float)uStack_768;
                    }
                    auVar82._8_8_ = uStack_5d8;
                    auVar82._0_8_ = local_5e0;
                    auVar82._16_8_ = uStack_5d0;
                    auVar82._24_8_ = uStack_5c8;
                    auVar166 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar82);
                    auVar204 = auVar142 & ~auVar166;
                    if ((((((((auVar204 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar204 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar204 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar204 >> 0x7f,0) == '\0') &&
                          (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar204 >> 0xbf,0) == '\0') &&
                        (auVar204 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar204[0x1f]) {
                      auVar166 = auVar166 ^ auVar142;
                      auVar180 = ZEXT3264(local_520);
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar98->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar168 = ZEXT1632(auVar168._0_16_);
                        auVar179 = ZEXT1632(auVar179._0_16_);
                        (*p_Var10)(&local_7b0);
                        auVar212 = ZEXT3264(local_760);
                        lVar97 = local_680._0_8_;
                        pGVar98 = (Geometry *)local_6a0._0_8_;
                        fVar101 = local_720;
                        fVar122 = fStack_71c;
                        fVar124 = fStack_718;
                        fVar126 = fStack_714;
                        fVar127 = fStack_710;
                        fVar128 = fStack_70c;
                        fVar129 = fStack_708;
                        fVar170 = fStack_704;
                        fVar171 = (float)local_780;
                        fVar181 = local_780._4_4_;
                        fVar151 = (float)uStack_778;
                        fVar123 = uStack_778._4_4_;
                        fVar125 = (float)uStack_770;
                        fVar245 = uStack_770._4_4_;
                        fVar246 = (float)uStack_768;
                      }
                      auVar83._8_8_ = uStack_5d8;
                      auVar83._0_8_ = local_5e0;
                      auVar83._16_8_ = uStack_5d0;
                      auVar83._24_8_ = uStack_5c8;
                      auVar204 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar83);
                      auVar142 = vpcmpeqd_avx2(auVar179,auVar179);
                      auVar166 = auVar204 ^ auVar142;
                      auVar236 = vpcmpeqd_avx2(auVar168,auVar168);
                      auVar142 = auVar142 & ~auVar204;
                      auVar180 = ZEXT3264(local_520);
                      if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar142 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar142 >> 0x7f,0) != '\0') ||
                            (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar142 >> 0xbf,0) != '\0') ||
                          (auVar142 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar142[0x1f] < '\0') {
                        auVar204 = auVar204 ^ auVar236;
                        auVar142 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])local_7b0.hit);
                        *(undefined1 (*) [32])(local_7b0.ray + 0x180) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x20));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1a0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x40));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1c0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x60));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x1e0) = auVar142;
                        auVar142 = vmaskmovps_avx(auVar204,*(undefined1 (*) [32])
                                                            (local_7b0.hit + 0x80));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x200) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar204,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x220) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar204,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x240) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar204,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x260) = auVar142;
                        auVar142 = vpmaskmovd_avx2(auVar204,*(undefined1 (*) [32])
                                                             (local_7b0.hit + 0x100));
                        *(undefined1 (*) [32])(local_7b0.ray + 0x280) = auVar142;
                      }
                    }
                    auVar239 = ZEXT464(uVar96);
                    if ((((((((auVar166 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar166 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar166 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar166 >> 0x7f,0) == '\0') &&
                          (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar166 >> 0xbf,0) == '\0') &&
                        (auVar166 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar166[0x1f]) {
                      *(uint *)(ray + k * 4 + 0x100) = uVar96;
                    }
                    *(undefined4 *)(local_600 + local_8a0._0_8_ * 4) = 0;
                    uVar229 = *(undefined4 *)(ray + k * 4 + 0x100);
                    auVar120._4_4_ = uVar229;
                    auVar120._0_4_ = uVar229;
                    auVar120._8_4_ = uVar229;
                    auVar120._12_4_ = uVar229;
                    auVar120._16_4_ = uVar229;
                    auVar120._20_4_ = uVar229;
                    auVar120._24_4_ = uVar229;
                    auVar120._28_4_ = uVar229;
                    auVar204 = vcmpps_avx(auVar180._0_32_,auVar120,2);
                    auVar142 = vandps_avx(auVar204,local_600);
                    local_600 = local_600 & auVar204;
                    bVar77 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar78 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar76 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar75 = SUB321(local_600 >> 0x7f,0) != '\0';
                    bVar74 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar73 = SUB321(local_600 >> 0xbf,0) != '\0';
                    bVar71 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar70 = local_600[0x1f] < '\0';
                    if (((((((bVar77 || bVar78) || bVar76) || bVar75) || bVar74) || bVar73) ||
                        bVar71) || bVar70) {
                      auVar145._8_4_ = 0x7f800000;
                      auVar145._0_8_ = 0x7f8000007f800000;
                      auVar145._12_4_ = 0x7f800000;
                      auVar145._16_4_ = 0x7f800000;
                      auVar145._20_4_ = 0x7f800000;
                      auVar145._24_4_ = 0x7f800000;
                      auVar145._28_4_ = 0x7f800000;
                      auVar204 = vblendvps_avx(auVar145,auVar180._0_32_,auVar142);
                      auVar166 = vshufps_avx(auVar204,auVar204,0xb1);
                      auVar166 = vminps_avx(auVar204,auVar166);
                      auVar236 = vshufpd_avx(auVar166,auVar166,5);
                      auVar166 = vminps_avx(auVar166,auVar236);
                      auVar236 = vpermpd_avx2(auVar166,0x4e);
                      auVar180 = ZEXT3264(auVar236);
                      auVar166 = vminps_avx(auVar166,auVar236);
                      auVar166 = vcmpps_avx(auVar204,auVar166,0);
                      auVar236 = auVar142 & auVar166;
                      auVar204 = auVar142;
                      if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar236 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar236 >> 0x7f,0) != '\0') ||
                            (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar236 >> 0xbf,0) != '\0') ||
                          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar236[0x1f] < '\0') {
                        auVar204 = vandps_avx(auVar166,auVar142);
                      }
                      uVar96 = vmovmskps_avx(auVar204);
                      local_8a0._0_4_ = 0;
                      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                        local_8a0._0_4_ = local_8a0._0_4_ + 1;
                      }
                      local_8a0._4_4_ = 0;
                      local_8a0._8_24_ = auVar139._8_24_;
                    }
                    local_600 = auVar142;
                  } while (((((((bVar77 || bVar78) || bVar76) || bVar75) || bVar74) || bVar73) ||
                           bVar71) || bVar70);
                }
              }
              auVar228 = ZEXT3264(auVar118);
              auVar148 = ZEXT3264(local_660);
            }
          }
          auVar222 = ZEXT3264(auVar110);
          lVar97 = lVar97 + 8;
        } while ((int)lVar97 < iVar91);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar107._4_4_ = uVar4;
      auVar107._0_4_ = uVar4;
      auVar107._8_4_ = uVar4;
      auVar107._12_4_ = uVar4;
      auVar187 = vcmpps_avx(local_2e0,auVar107,2);
      uVar94 = vmovmskps_avx(auVar187);
      uVar94 = (uint)uVar99 & uVar94;
    } while (uVar94 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }